

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::NewFrame(void)

{
  ImVec2 *pIVar1;
  ImDrawListFlags *pIVar2;
  float *pfVar3;
  ImGuiWindow **ppIVar4;
  int *piVar5;
  ImS8 *pIVar6;
  bool *pbVar7;
  ImU16 *pIVar8;
  double dVar9;
  uint uVar10;
  ImGuiID IVar11;
  ImGuiContextHook *pIVar12;
  char *pcVar13;
  uint *puVar14;
  ImGuiViewportP *pIVar15;
  ImGuiInputEvent *pIVar16;
  ImGuiTableTempData *pIVar17;
  ImGuiWindowStackData *pIVar18;
  ImGuiPopupData *pIVar19;
  int *piVar20;
  ImGuiGroupData *pIVar21;
  ImGuiStackLevelInfo *pIVar22;
  ImVec2 IVar23;
  undefined8 uVar24;
  ImGuiContext *pIVar25;
  ImGuiContext *pIVar26;
  ImGuiContext *pIVar27;
  ImGuiContext *pIVar28;
  undefined3 uVar29;
  bool bVar30;
  bool bVar31;
  bool bVar32;
  ImGuiContext *g_3;
  uint *__dest;
  ImGuiInputEvent *__dest_00;
  ImGuiWindow *pIVar33;
  ImGuiWindowStackData *__dest_01;
  ImGuiPopupData *__dest_02;
  int *piVar34;
  ImGuiGroupData *__dest_03;
  ImGuiStackLevelInfo *__dest_04;
  int n;
  uint uVar35;
  int iVar36;
  ImGuiScrollFlags scroll_flags;
  ulong uVar37;
  ImGuiWindow *pIVar38;
  ImGuiWindow *window;
  byte bVar39;
  int i_1;
  ImGuiContext *g;
  int iVar40;
  ImGuiID IVar41;
  ImGuiWindow *old_nav_window;
  ImRect *pIVar42;
  float *pfVar43;
  ImGuiNavLayer IVar44;
  ImFont *font;
  ulong uVar45;
  float *pfVar46;
  ImGuiWindow *child_window;
  long lVar47;
  char cVar48;
  ImGuiContext *g_1;
  long lVar49;
  ImGuiContext *g_2;
  long lVar50;
  bool bVar51;
  bool bVar52;
  uint uVar53;
  float fVar54;
  ImVec2 IVar56;
  float fVar55;
  ImVec2 IVar57;
  ImVec2 IVar58;
  ImVec2 IVar59;
  ImVec2 IVar60;
  ImVec2 IVar61;
  ImVec2 IVar62;
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  float fVar65;
  float fVar70;
  float fVar71;
  ImVec2 IVar66;
  ImVec2 IVar67;
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  float fVar72;
  float fVar73;
  float fVar74;
  float scale;
  float fVar75;
  float local_78;
  ImRect local_48;
  
  pIVar25 = GImGui;
  bVar39 = 0;
  lVar49 = (long)(GImGui->Hooks).Size;
  if (0 < lVar49) {
    lVar50 = -lVar49;
    lVar47 = lVar49 + 1;
    lVar49 = lVar49 * 0x20;
    do {
      pIVar12 = (pIVar25->Hooks).Data;
      if (*(int *)(pIVar12 + lVar49 + -0x1c) == 7) {
        memmove(pIVar12 + lVar49 + -0x20,pIVar12 + lVar49,((pIVar25->Hooks).Size + lVar50) * 0x20);
        (pIVar25->Hooks).Size = (pIVar25->Hooks).Size + -1;
      }
      lVar50 = lVar50 + 1;
      lVar47 = lVar47 + -1;
      lVar49 = lVar49 + -0x20;
    } while (1 < lVar47);
  }
  if (0 < (pIVar25->Hooks).Size) {
    lVar49 = 0;
    lVar47 = 0;
    do {
      pIVar12 = (pIVar25->Hooks).Data;
      if (*(int *)(pIVar12 + lVar49 + 4) == 0) {
        (**(code **)(pIVar12 + lVar49 + 0x10))(pIVar25,pIVar12 + lVar49);
      }
      lVar47 = lVar47 + 1;
      lVar49 = lVar49 + 0x20;
    } while (lVar47 < (pIVar25->Hooks).Size);
  }
  pIVar26 = GImGui;
  if (((GImGui->IO).ConfigWindowsResizeFromEdges == true) && (((GImGui->IO).BackendFlags & 2) == 0))
  {
    (GImGui->IO).ConfigWindowsResizeFromEdges = false;
  }
  if (pIVar26->SettingsLoaded == false) {
    pcVar13 = (pIVar26->IO).IniFilename;
    if (pcVar13 != (char *)0x0) {
      LoadIniSettingsFromDisk(pcVar13);
    }
    pIVar26->SettingsLoaded = true;
  }
  if ((0.0 < pIVar26->SettingsDirtyTimer) &&
     (fVar54 = pIVar26->SettingsDirtyTimer - (pIVar26->IO).DeltaTime,
     pIVar26->SettingsDirtyTimer = fVar54, fVar54 <= 0.0)) {
    pcVar13 = (pIVar26->IO).IniFilename;
    if (pcVar13 == (char *)0x0) {
      (pIVar26->IO).WantSaveIniSettings = true;
    }
    else {
      SaveIniSettingsToDisk(pcVar13);
    }
    pIVar26->SettingsDirtyTimer = 0.0;
  }
  pIVar25->Time = (double)(pIVar25->IO).DeltaTime + pIVar25->Time;
  pIVar25->WithinFrameScope = true;
  pIVar25->FrameCount = pIVar25->FrameCount + 1;
  pIVar25->TooltipOverrideCount = 0;
  pIVar25->WindowsActiveCount = 0;
  iVar40 = (pIVar25->MenusIdSubmittedThisFrame).Capacity;
  if (iVar40 < 0) {
    uVar35 = iVar40 / 2 + iVar40;
    uVar37 = 0;
    if (0 < (int)uVar35) {
      uVar37 = (ulong)uVar35;
    }
    if (GImGui != (ImGuiContext *)0x0) {
      piVar20 = &(GImGui->IO).MetricsActiveAllocations;
      *piVar20 = *piVar20 + 1;
    }
    __dest = (uint *)(*GImAllocatorAllocFunc)(uVar37 * 4,GImAllocatorUserData);
    puVar14 = (pIVar25->MenusIdSubmittedThisFrame).Data;
    if (puVar14 != (uint *)0x0) {
      memcpy(__dest,puVar14,(long)(pIVar25->MenusIdSubmittedThisFrame).Size << 2);
      puVar14 = (pIVar25->MenusIdSubmittedThisFrame).Data;
      if ((puVar14 != (uint *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
        piVar20 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar20 = *piVar20 + -1;
      }
      (*GImAllocatorFreeFunc)(puVar14,GImAllocatorUserData);
    }
    (pIVar25->MenusIdSubmittedThisFrame).Data = __dest;
    (pIVar25->MenusIdSubmittedThisFrame).Capacity = (int)uVar37;
  }
  (pIVar25->MenusIdSubmittedThisFrame).Size = 0;
  fVar54 = (pIVar25->IO).DeltaTime;
  iVar40 = pIVar25->FramerateSecPerFrameIdx;
  pIVar25->FramerateSecPerFrameAccum =
       (fVar54 - pIVar25->FramerateSecPerFrame[iVar40]) + pIVar25->FramerateSecPerFrameAccum;
  pIVar25->FramerateSecPerFrame[iVar40] = fVar54;
  iVar36 = iVar40 + (int)((ulong)((long)(iVar40 + 1) * -0x77777777) >> 0x20) + 1;
  pIVar25->FramerateSecPerFrameIdx = iVar40 + 1 + ((iVar36 >> 6) - (iVar36 >> 0x1f)) * -0x78;
  iVar40 = 0x77;
  if (pIVar25->FramerateSecPerFrameCount < 0x77) {
    iVar40 = pIVar25->FramerateSecPerFrameCount;
  }
  pIVar25->FramerateSecPerFrameCount = iVar40 + 1;
  uVar35 = -(uint)(0.0 < pIVar25->FramerateSecPerFrameAccum);
  (pIVar25->IO).Framerate =
       (float)(~uVar35 & 0x7f7fffff |
              (uint)(1.0 / (pIVar25->FramerateSecPerFrameAccum / (float)(iVar40 + 1))) & uVar35);
  pIVar26 = GImGui;
  pIVar15 = *(GImGui->Viewports).Data;
  (pIVar15->super_ImGuiViewport).Flags = 5;
  (pIVar15->super_ImGuiViewport).Pos.x = 0.0;
  (pIVar15->super_ImGuiViewport).Pos.y = 0.0;
  (pIVar15->super_ImGuiViewport).Size = (pIVar26->IO).DisplaySize;
  if (0 < (pIVar26->Viewports).Size) {
    lVar49 = 0;
    do {
      pIVar15 = (pIVar26->Viewports).Data[lVar49];
      pIVar15->WorkOffsetMin = pIVar15->BuildWorkOffsetMin;
      pIVar15->WorkOffsetMax = pIVar15->BuildWorkOffsetMax;
      (pIVar15->BuildWorkOffsetMin).x = 0.0;
      (pIVar15->BuildWorkOffsetMin).y = 0.0;
      (pIVar15->BuildWorkOffsetMax).x = 0.0;
      (pIVar15->BuildWorkOffsetMax).y = 0.0;
      IVar58 = (pIVar15->super_ImGuiViewport).Pos;
      IVar56 = (pIVar15->super_ImGuiViewport).Size;
      fVar54 = (pIVar15->WorkOffsetMin).x;
      fVar70 = (pIVar15->WorkOffsetMin).y;
      IVar61.x = IVar58.x + fVar54;
      IVar61.y = IVar58.y + fVar70;
      fVar54 = (IVar56.x - fVar54) + (pIVar15->WorkOffsetMax).x;
      fVar70 = (IVar56.y - fVar70) + (pIVar15->WorkOffsetMax).y;
      IVar58.y = (float)(-(uint)(0.0 < fVar70) & (uint)fVar70);
      IVar58.x = (float)(-(uint)(0.0 < fVar54) & (uint)fVar54);
      (pIVar15->super_ImGuiViewport).WorkPos = IVar61;
      (pIVar15->super_ImGuiViewport).WorkSize = IVar58;
      lVar49 = lVar49 + 1;
    } while (lVar49 < (pIVar26->Viewports).Size);
  }
  ((pIVar25->IO).Fonts)->Locked = true;
  font = (GImGui->IO).FontDefault;
  if (font == (ImFont *)0x0) {
    font = *(((GImGui->IO).Fonts)->Fonts).Data;
  }
  SetCurrentFont(font);
  lVar49 = (long)(pIVar25->Viewports).Size;
  if (lVar49 < 1) {
    fVar54 = 3.4028235e+38;
    fVar70 = 3.4028235e+38;
    fVar72 = -3.4028235e+38;
    fVar74 = -3.4028235e+38;
  }
  else {
    fVar54 = 3.4028235e+38;
    fVar70 = 3.4028235e+38;
    fVar74 = -3.4028235e+38;
    lVar47 = 0;
    do {
      pIVar15 = (pIVar25->Viewports).Data[lVar47];
      IVar58 = (pIVar15->super_ImGuiViewport).Pos;
      IVar56 = (pIVar15->super_ImGuiViewport).Size;
      fVar75 = IVar58.x;
      fVar72 = IVar56.x + fVar75;
      fVar71 = IVar58.y;
      fVar73 = IVar56.y + fVar71;
      uVar35 = -(uint)(fVar74 < fVar73);
      fVar72 = (float)((uint)fVar72 & -(uint)(0.0 < fVar72));
      fVar54 = (float)(~-(uint)(fVar75 < fVar54) & (uint)fVar54 |
                      (uint)fVar75 & -(uint)(fVar75 < fVar54));
      fVar70 = (float)(~-(uint)(fVar71 < fVar70) & (uint)fVar70 |
                      (uint)fVar71 & -(uint)(fVar71 < fVar70));
      fVar74 = (float)(~uVar35 & (uint)fVar74 | (uint)fVar73 & uVar35);
      lVar47 = lVar47 + 1;
    } while (lVar49 != lVar47);
  }
  (pIVar25->DrawListSharedData).ClipRectFullscreen.x = fVar54;
  (pIVar25->DrawListSharedData).ClipRectFullscreen.y = fVar70;
  (pIVar25->DrawListSharedData).ClipRectFullscreen.z = fVar72;
  (pIVar25->DrawListSharedData).ClipRectFullscreen.w = fVar74;
  fVar54 = (pIVar25->Style).CircleTessellationMaxError;
  (pIVar25->DrawListSharedData).CurveTessellationTol = (pIVar25->Style).CurveTessellationTol;
  ImDrawListSharedData::SetCircleTessellationMaxError(&pIVar25->DrawListSharedData,fVar54);
  uVar35 = (uint)(pIVar25->Style).AntiAliasedLines;
  (pIVar25->DrawListSharedData).InitialFlags = uVar35;
  if (((pIVar25->Style).AntiAliasedLinesUseTex != false) &&
     ((pIVar25->Font->ContainerAtlas->Flags & 4) == 0)) {
    (pIVar25->DrawListSharedData).InitialFlags = uVar35 | 2;
  }
  if ((pIVar25->Style).AntiAliasedFill == true) {
    pIVar2 = &(pIVar25->DrawListSharedData).InitialFlags;
    *(byte *)pIVar2 = (byte)*pIVar2 | 4;
  }
  if (((pIVar25->IO).BackendFlags & 8) != 0) {
    pIVar2 = &(pIVar25->DrawListSharedData).InitialFlags;
    *(byte *)pIVar2 = (byte)*pIVar2 | 8;
  }
  if (0 < (pIVar25->Viewports).Size) {
    lVar49 = 0;
    do {
      pIVar15 = (pIVar25->Viewports).Data[lVar49];
      (pIVar15->DrawDataP).DisplaySize.x = 0.0;
      (pIVar15->DrawDataP).DisplaySize.y = 0.0;
      (pIVar15->DrawDataP).FramebufferScale.x = 0.0;
      (pIVar15->DrawDataP).FramebufferScale.y = 0.0;
      (pIVar15->DrawDataP).CmdLists = (ImDrawList **)0x0;
      (pIVar15->DrawDataP).DisplayPos.x = 0.0;
      (pIVar15->DrawDataP).DisplayPos.y = 0.0;
      (pIVar15->DrawDataP).Valid = false;
      *(undefined3 *)&(pIVar15->DrawDataP).field_0x1 = 0;
      (pIVar15->DrawDataP).CmdListsCount = 0;
      (pIVar15->DrawDataP).TotalIdxCount = 0;
      (pIVar15->DrawDataP).TotalVtxCount = 0;
      lVar49 = lVar49 + 1;
    } while (lVar49 < (pIVar25->Viewports).Size);
  }
  pIVar26 = GImGui;
  if ((pIVar25->DragDropActive != false) &&
     (IVar41 = (pIVar25->DragDropPayload).SourceId, IVar41 == pIVar25->ActiveId)) {
    if (GImGui->ActiveId == IVar41) {
      GImGui->ActiveIdIsAlive = IVar41;
    }
    if (pIVar26->ActiveIdPreviousFrame == IVar41) {
      pIVar26->ActiveIdPreviousFrameIsAlive = true;
    }
  }
  if (pIVar25->HoveredIdPreviousFrame == 0) {
    pIVar25->HoveredIdTimer = 0.0;
LAB_0010fa6d:
    pIVar25->HoveredIdNotActiveTimer = 0.0;
  }
  else if ((pIVar25->HoveredId != 0) && (pIVar25->ActiveId == pIVar25->HoveredId))
  goto LAB_0010fa6d;
  IVar41 = pIVar25->HoveredId;
  if ((IVar41 != 0) &&
     (pIVar25->HoveredIdTimer = (pIVar25->IO).DeltaTime + pIVar25->HoveredIdTimer,
     pIVar25->ActiveId != IVar41)) {
    pIVar25->HoveredIdNotActiveTimer = (pIVar25->IO).DeltaTime + pIVar25->HoveredIdNotActiveTimer;
  }
  pIVar25->HoveredIdPreviousFrame = IVar41;
  pIVar25->HoveredIdPreviousFrameUsingMouseWheel = pIVar25->HoveredIdUsingMouseWheel;
  pIVar25->HoveredId = 0;
  pIVar25->HoveredIdAllowOverlap = false;
  pIVar25->HoveredIdUsingMouseWheel = false;
  pIVar25->HoveredIdDisabled = false;
  IVar41 = pIVar25->ActiveId;
  if (((pIVar25->ActiveIdIsAlive != IVar41) && (IVar41 != 0)) &&
     (pIVar25->ActiveIdPreviousFrame == IVar41)) {
    ClearActiveID();
  }
  IVar41 = pIVar25->ActiveId;
  if (IVar41 != 0) {
    pIVar25->ActiveIdTimer = (pIVar25->IO).DeltaTime + pIVar25->ActiveIdTimer;
  }
  pIVar25->LastActiveIdTimer = (pIVar25->IO).DeltaTime + pIVar25->LastActiveIdTimer;
  pIVar25->ActiveIdPreviousFrame = IVar41;
  pIVar25->ActiveIdPreviousFrameWindow = pIVar25->ActiveIdWindow;
  pIVar25->ActiveIdPreviousFrameHasBeenEditedBefore = pIVar25->ActiveIdHasBeenEditedBefore;
  pIVar25->ActiveIdIsAlive = 0;
  pIVar25->ActiveIdHasBeenEditedThisFrame = false;
  pIVar25->ActiveIdPreviousFrameIsAlive = false;
  pIVar25->ActiveIdIsJustActivated = false;
  if (IVar41 != pIVar25->TempInputId && pIVar25->TempInputId != 0) {
    pIVar25->TempInputId = 0;
  }
  if (IVar41 == 0) {
    (pIVar25->ActiveIdUsingKeyInputMask).Storage[1] = 0;
    (pIVar25->ActiveIdUsingKeyInputMask).Storage[2] = 0;
    (pIVar25->ActiveIdUsingKeyInputMask).Storage[3] = 0;
    (pIVar25->ActiveIdUsingKeyInputMask).Storage[4] = 0;
    pIVar25->ActiveIdUsingNavDirMask = 0;
    pIVar25->ActiveIdUsingNavInputMask = 0;
    (pIVar25->ActiveIdUsingKeyInputMask).Storage[0] = 0;
    (pIVar25->ActiveIdUsingKeyInputMask).Storage[1] = 0;
  }
  pIVar25->DragDropAcceptIdPrev = pIVar25->DragDropAcceptIdCurr;
  pIVar25->DragDropAcceptIdCurrRectSurface = 3.4028235e+38;
  pIVar25->DragDropAcceptIdCurr = 0;
  pIVar25->DragDropWithinSource = false;
  pIVar25->DragDropWithinTarget = false;
  pIVar25->DragDropHoldJustPressedId = 0;
  iVar40 = (pIVar25->InputEventsTrail).Capacity;
  if (iVar40 < 0) {
    uVar35 = iVar40 / 2 + iVar40;
    uVar37 = 0;
    if (0 < (int)uVar35) {
      uVar37 = (ulong)uVar35;
    }
    if (GImGui != (ImGuiContext *)0x0) {
      piVar20 = &(GImGui->IO).MetricsActiveAllocations;
      *piVar20 = *piVar20 + 1;
    }
    __dest_00 = (ImGuiInputEvent *)(*GImAllocatorAllocFunc)(uVar37 * 0x18,GImAllocatorUserData);
    pIVar16 = (pIVar25->InputEventsTrail).Data;
    if (pIVar16 != (ImGuiInputEvent *)0x0) {
      memcpy(__dest_00,pIVar16,(long)(pIVar25->InputEventsTrail).Size * 0x18);
      pIVar16 = (pIVar25->InputEventsTrail).Data;
      if ((pIVar16 != (ImGuiInputEvent *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
        piVar20 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar20 = *piVar20 + -1;
      }
      (*GImAllocatorFreeFunc)(pIVar16,GImAllocatorUserData);
    }
    (pIVar25->InputEventsTrail).Data = __dest_00;
    (pIVar25->InputEventsTrail).Capacity = (int)uVar37;
  }
  (pIVar25->InputEventsTrail).Size = 0;
  UpdateInputEvents((pIVar25->IO).ConfigInputTrickleEventQueue);
  pIVar26 = GImGui;
  if ((GImGui->IO).BackendUsingLegacyKeyArrays != '\0') {
    lVar49 = 0;
    do {
      lVar47 = (long)(pIVar26->IO).KeyMap[lVar49 + 0x200];
      if (lVar47 != -1) {
        (pIVar26->IO).KeyMap[lVar47] = (int)lVar49 + 0x200;
      }
      lVar49 = lVar49 + 1;
    } while (lVar49 != 0x85);
    uVar37 = 0;
    do {
      bVar51 = (pIVar26->IO).KeysDown[uVar37];
      if ((bVar51 != false) || ((pIVar26->IO).BackendUsingLegacyKeyArrays == '\x01')) {
        uVar35 = (pIVar26->IO).KeyMap[uVar37];
        uVar45 = uVar37 & 0xffffffff;
        if (uVar35 != 0xffffffff) {
          uVar45 = (ulong)uVar35;
        }
        (pIVar26->IO).KeysData[(int)uVar45].Down = bVar51;
        if (uVar37 != uVar45) {
          (pIVar26->IO).KeysDown[(int)uVar45] = (pIVar26->IO).KeysDown[uVar37];
        }
        (pIVar26->IO).BackendUsingLegacyKeyArrays = '\x01';
      }
      uVar37 = uVar37 + 1;
    } while (uVar37 != 0x200);
    if ((pIVar26->IO).BackendUsingLegacyKeyArrays == '\x01') {
      bVar51 = (pIVar26->IO).KeyShift;
      (pIVar26->IO).KeysData[0x281].Down = (pIVar26->IO).KeyCtrl;
      (pIVar26->IO).KeysData[0x282].Down = bVar51;
      (pIVar26->IO).KeysData[0x283].Down = (pIVar26->IO).KeyAlt;
      (pIVar26->IO).KeysData[0x284].Down = (pIVar26->IO).KeySuper;
    }
  }
  bVar51 = (pIVar26->IO).KeyCtrl;
  bVar52 = (pIVar26->IO).KeyShift;
  uVar35 = bVar51 + 2;
  if (bVar52 == false) {
    uVar35 = (uint)bVar51;
  }
  uVar10 = uVar35 + 4;
  if ((pIVar26->IO).KeyAlt == false) {
    uVar10 = uVar35;
  }
  uVar35 = uVar10 + 8;
  if ((pIVar26->IO).KeySuper == false) {
    uVar35 = uVar10;
  }
  (pIVar26->IO).KeyMods = uVar35;
  uVar35 = (pIVar26->IO).BackendFlags;
  if ((uVar35 & 1) == 0) {
    lVar49 = 0;
    do {
      (&(pIVar26->IO).KeysData[0x269].Down)[lVar49] = false;
      *(undefined4 *)((long)&(pIVar26->IO).KeysData[0x269].AnalogValue + lVar49) = 0;
      lVar49 = lVar49 + 0x10;
    } while (lVar49 != 0x180);
  }
  lVar49 = 0xe0c;
  do {
    fVar54 = *(float *)((long)pIVar26 + lVar49 + -4);
    *(float *)(&pIVar26->Initialized + lVar49) = fVar54;
    fVar70 = -1.0;
    if ((*(char *)((long)pIVar26 + lVar49 + -8) == '\x01') && (fVar70 = 0.0, 0.0 <= fVar54)) {
      fVar70 = fVar54 + (pIVar26->IO).DeltaTime;
    }
    *(float *)((long)pIVar26 + lVar49 + -4) = fVar70;
    lVar49 = lVar49 + 0x10;
  } while (lVar49 != 0x365c);
  (pIVar26->IO).WantSetMousePos = false;
  uVar10 = (pIVar26->IO).ConfigFlags;
  uVar35 = uVar35 & (uVar10 & 2) >> 1;
  if ((uVar35 == 1) && ((pIVar26->IO).BackendUsingLegacyNavInputArray == false)) {
    fVar54 = (pIVar26->IO).KeysData[0x26c].AnalogValue;
    (pIVar26->IO).NavInputs[0] = fVar54;
    if (0.0 < fVar54) {
      pIVar26->NavInputSource = ImGuiInputSource_Gamepad;
    }
    fVar54 = (pIVar26->IO).KeysData[0x26e].AnalogValue;
    (pIVar26->IO).NavInputs[1] = fVar54;
    if (0.0 < fVar54) {
      pIVar26->NavInputSource = ImGuiInputSource_Gamepad;
    }
    fVar54 = (pIVar26->IO).KeysData[0x26d].AnalogValue;
    (pIVar26->IO).NavInputs[3] = fVar54;
    if (0.0 < fVar54) {
      pIVar26->NavInputSource = ImGuiInputSource_Gamepad;
    }
    fVar54 = (pIVar26->IO).KeysData[0x26b].AnalogValue;
    (pIVar26->IO).NavInputs[2] = fVar54;
    if (0.0 < fVar54) {
      pIVar26->NavInputSource = ImGuiInputSource_Gamepad;
    }
    fVar54 = (pIVar26->IO).KeysData[0x271].AnalogValue;
    (pIVar26->IO).NavInputs[4] = fVar54;
    if (0.0 < fVar54) {
      pIVar26->NavInputSource = ImGuiInputSource_Gamepad;
    }
    fVar54 = (pIVar26->IO).KeysData[0x272].AnalogValue;
    (pIVar26->IO).NavInputs[5] = fVar54;
    if (0.0 < fVar54) {
      pIVar26->NavInputSource = ImGuiInputSource_Gamepad;
    }
    fVar54 = (pIVar26->IO).KeysData[0x26f].AnalogValue;
    (pIVar26->IO).NavInputs[6] = fVar54;
    if (0.0 < fVar54) {
      pIVar26->NavInputSource = ImGuiInputSource_Gamepad;
    }
    fVar54 = (pIVar26->IO).KeysData[0x270].AnalogValue;
    (pIVar26->IO).NavInputs[7] = fVar54;
    if (0.0 < fVar54) {
      pIVar26->NavInputSource = ImGuiInputSource_Gamepad;
    }
    fVar54 = (pIVar26->IO).KeysData[0x273].AnalogValue;
    fVar70 = (pIVar26->IO).KeysData[0x274].AnalogValue;
    (pIVar26->IO).NavInputs[0xc] = fVar54;
    (pIVar26->IO).NavInputs[0xd] = fVar70;
    (pIVar26->IO).NavInputs[0xe] = fVar54;
    (pIVar26->IO).NavInputs[0xf] = fVar70;
    (pIVar26->IO).NavInputs[8] = (pIVar26->IO).KeysData[0x27b].AnalogValue;
    (pIVar26->IO).NavInputs[9] = (pIVar26->IO).KeysData[0x27c].AnalogValue;
    (pIVar26->IO).NavInputs[10] = (pIVar26->IO).KeysData[0x279].AnalogValue;
    (pIVar26->IO).NavInputs[0xb] = (pIVar26->IO).KeysData[0x27a].AnalogValue;
  }
  if ((uVar10 & 1) != 0) {
    if ((pIVar26->IO).KeysData[0x20c].Down == true) {
      (pIVar26->IO).NavInputs[0] = 1.0;
      pIVar26->NavInputSource = ImGuiInputSource_Keyboard;
    }
    if ((pIVar26->IO).KeysData[0x20d].Down == true) {
      (pIVar26->IO).NavInputs[2] = 1.0;
      pIVar26->NavInputSource = ImGuiInputSource_Keyboard;
    }
    if ((pIVar26->IO).KeysData[0x20e].Down == true) {
      (pIVar26->IO).NavInputs[1] = 1.0;
      pIVar26->NavInputSource = ImGuiInputSource_Keyboard;
    }
    if ((pIVar26->IO).KeysData[0x201].Down == true) {
      (pIVar26->IO).NavInputs[0x10] = 1.0;
      pIVar26->NavInputSource = ImGuiInputSource_Keyboard;
    }
    if ((pIVar26->IO).KeysData[0x202].Down == true) {
      (pIVar26->IO).NavInputs[0x11] = 1.0;
      pIVar26->NavInputSource = ImGuiInputSource_Keyboard;
    }
    if ((pIVar26->IO).KeysData[0x203].Down == true) {
      (pIVar26->IO).NavInputs[0x12] = 1.0;
      pIVar26->NavInputSource = ImGuiInputSource_Keyboard;
    }
    if ((pIVar26->IO).KeysData[0x204].Down == true) {
      (pIVar26->IO).NavInputs[0x13] = 1.0;
      pIVar26->NavInputSource = ImGuiInputSource_Keyboard;
    }
    if (bVar51 != false) {
      (pIVar26->IO).NavInputs[0xe] = 1.0;
    }
    if (bVar52 != false) {
      (pIVar26->IO).NavInputs[0xf] = 1.0;
    }
  }
  pfVar3 = (pIVar26->IO).NavInputsDownDuration;
  pfVar43 = pfVar3;
  pfVar46 = (pIVar26->IO).NavInputsDownDurationPrev;
  for (lVar49 = 0x14; lVar49 != 0; lVar49 = lVar49 + -1) {
    *pfVar46 = *pfVar43;
    pfVar43 = pfVar43 + (ulong)bVar39 * -2 + 1;
    pfVar46 = pfVar46 + (ulong)bVar39 * -2 + 1;
  }
  lVar49 = 0;
  do {
    fVar54 = -1.0;
    if (0.0 < (pIVar26->IO).NavInputs[lVar49]) {
      fVar54 = 0.0;
      if (0.0 <= pfVar3[lVar49]) {
        fVar54 = pfVar3[lVar49] + (pIVar26->IO).DeltaTime;
      }
    }
    pfVar3[lVar49] = fVar54;
    lVar49 = lVar49 + 1;
  } while (lVar49 != 0x14);
  if (pIVar26->NavInitResultId != 0) {
    NavInitRequestApplyResult();
  }
  pIVar26->NavInitRequest = false;
  pIVar26->NavInitRequestFromMove = false;
  pIVar26->NavInitResultId = 0;
  pIVar26->NavJustMovedToId = 0;
  if (pIVar26->NavMoveSubmitted == true) {
    NavMoveRequestApplyResult();
  }
  pIVar26->NavTabbingCounter = 0;
  pIVar26->NavMoveSubmitted = false;
  pIVar26->NavMoveScoringItems = false;
  if ((((pIVar26->NavMousePosDirty == true) && (pIVar26->NavIdIsAlive == true)) &&
      (pIVar26->NavDisableHighlight == false)) && (pIVar26->NavDisableMouseHover == true)) {
    bVar51 = pIVar26->NavWindow != (ImGuiWindow *)0x0;
  }
  else {
    bVar51 = false;
  }
  pIVar26->NavMousePosDirty = false;
  pIVar33 = pIVar26->NavWindow;
  pIVar38 = pIVar33;
  if (pIVar33 != (ImGuiWindow *)0x0) {
    do {
      if ((pIVar38->RootWindow == pIVar38) || ((pIVar38->Flags & 0x14000000) != 0)) {
        if (pIVar38 != pIVar33) {
          pIVar38->NavLastChildNavWindow = pIVar33;
        }
        break;
      }
      ppIVar4 = &pIVar38->ParentWindow;
      pIVar38 = *ppIVar4;
    } while (*ppIVar4 != (ImGuiWindow *)0x0);
    if (((pIVar33 != (ImGuiWindow *)0x0) && (pIVar33->NavLastChildNavWindow != (ImGuiWindow *)0x0))
       && (pIVar26->NavLayer == ImGuiNavLayer_Main)) {
      pIVar33->NavLastChildNavWindow = (ImGuiWindow *)0x0;
    }
  }
  pIVar28 = GImGui;
  pIVar33 = GetTopMostPopupModal();
  if (pIVar33 != (ImGuiWindow *)0x0) {
    pIVar28->NavWindowingTarget = (ImGuiWindow *)0x0;
  }
  if ((pIVar28->NavWindowingTargetAnim != (ImGuiWindow *)0x0) &&
     (pIVar28->NavWindowingTarget == (ImGuiWindow *)0x0)) {
    fVar54 = (pIVar28->IO).DeltaTime * -10.0 + pIVar28->NavWindowingHighlightAlpha;
    fVar54 = (float)(-(uint)(0.0 <= fVar54) & (uint)fVar54);
    pIVar28->NavWindowingHighlightAlpha = fVar54;
    if ((pIVar28->DimBgRatio <= 0.0) && (fVar54 <= 0.0)) {
      pIVar28->NavWindowingTargetAnim = (ImGuiWindow *)0x0;
    }
  }
  if ((pIVar33 == (ImGuiWindow *)0x0) && (pIVar28->NavWindowingTarget == (ImGuiWindow *)0x0)) {
    bVar52 = (bool)(-((pIVar28->IO).NavInputsDownDuration[3] == 0.0) & 1);
  }
  else {
    bVar52 = false;
  }
  if (((pIVar33 == (ImGuiWindow *)0x0) && (pIVar28->NavWindowingTarget == (ImGuiWindow *)0x0)) &&
     ((pIVar28->IO).KeyCtrl == true)) {
    bVar30 = IsKeyPressed(0x200,true);
  }
  else {
    bVar30 = false;
  }
  if ((bVar52 | bVar30) == 1) {
    pIVar33 = pIVar28->NavWindow;
    if (pIVar33 == (ImGuiWindow *)0x0) {
      pIVar33 = FindWindowNavFocusable((pIVar28->WindowsFocusOrder).Size + -1,-0x7fffffff,-1);
    }
    if (pIVar33 != (ImGuiWindow *)0x0) {
      pIVar33 = pIVar33->RootWindow;
      pIVar28->NavWindowingTargetAnim = pIVar33;
      pIVar28->NavWindowingTarget = pIVar33;
      pIVar28->NavWindowingTimer = 0.0;
      pIVar28->NavWindowingHighlightAlpha = 0.0;
      pIVar28->NavWindowingToggleLayer = bVar52;
      pIVar28->NavInputSource = bVar30 ^ ImGuiInputSource_Gamepad;
    }
  }
  fVar54 = (pIVar28->IO).DeltaTime + pIVar28->NavWindowingTimer;
  pIVar28->NavWindowingTimer = fVar54;
  if ((pIVar28->NavWindowingTarget == (ImGuiWindow *)0x0) ||
     (pIVar28->NavInputSource != ImGuiInputSource_Gamepad)) {
LAB_00110463:
    bVar52 = false;
    pIVar33 = (ImGuiWindow *)0x0;
  }
  else {
    fVar70 = (fVar54 + -0.2) / 0.05;
    fVar54 = 1.0;
    if (fVar70 <= 1.0) {
      fVar54 = fVar70;
    }
    fVar54 = (float)(~-(uint)(fVar70 < 0.0) & (uint)fVar54);
    uVar53 = -(uint)(fVar54 <= pIVar28->NavWindowingHighlightAlpha);
    pIVar28->NavWindowingHighlightAlpha =
         (float)(uVar53 & (uint)pIVar28->NavWindowingHighlightAlpha | ~uVar53 & (uint)fVar54);
    fVar54 = GetNavInputAmount(0xc,ImGuiInputReadMode_RepeatSlow);
    fVar70 = GetNavInputAmount(0xd,ImGuiInputReadMode_RepeatSlow);
    iVar40 = (uint)(0.0 < fVar54) - (uint)(0.0 < fVar70);
    if (iVar40 != 0) {
      NavUpdateWindowingHighlightWindow(iVar40);
      pIVar28->NavWindowingHighlightAlpha = 1.0;
    }
    if (0.0 < (GImGui->IO).NavInputs[3]) goto LAB_00110463;
    pbVar7 = &pIVar28->NavWindowingToggleLayer;
    *pbVar7 = (bool)(*pbVar7 &
                    (pIVar28->NavWindowingHighlightAlpha <= 1.0 &&
                    pIVar28->NavWindowingHighlightAlpha != 1.0));
    if (*pbVar7 == false) {
      pIVar33 = pIVar28->NavWindowingTarget;
      bVar52 = false;
    }
    else {
      bVar52 = pIVar28->NavWindow != (ImGuiWindow *)0x0;
      pIVar33 = (ImGuiWindow *)0x0;
    }
    pIVar28->NavWindowingTarget = (ImGuiWindow *)0x0;
  }
  if ((pIVar28->NavWindowingTarget != (ImGuiWindow *)0x0) &&
     (pIVar28->NavInputSource == ImGuiInputSource_Keyboard)) {
    fVar70 = (pIVar28->NavWindowingTimer + -0.2) / 0.05;
    fVar54 = 1.0;
    if (fVar70 <= 1.0) {
      fVar54 = fVar70;
    }
    fVar54 = (float)(~-(uint)(fVar70 < 0.0) & (uint)fVar54);
    uVar53 = -(uint)(fVar54 <= pIVar28->NavWindowingHighlightAlpha);
    pIVar28->NavWindowingHighlightAlpha =
         (float)(uVar53 & (uint)pIVar28->NavWindowingHighlightAlpha | ~uVar53 & (uint)fVar54);
    bVar30 = IsKeyPressed(0x200,true);
    if (bVar30) {
      NavUpdateWindowingHighlightWindow((pIVar28->IO).KeyShift - 1 | 1);
    }
    if ((pIVar28->IO).KeyCtrl == false) {
      pIVar33 = pIVar28->NavWindowingTarget;
    }
  }
  if ((((pIVar28->IO).ConfigFlags & 1) != 0) && (bVar30 = IsKeyPressed(0x283,true), bVar30)) {
    pIVar28->NavWindowingToggleLayer = true;
    pIVar28->NavInputSource = ImGuiInputSource_Keyboard;
  }
  if ((pIVar28->NavWindowingToggleLayer == true) &&
     (pIVar28->NavInputSource == ImGuiInputSource_Keyboard)) {
    if ((0 < (pIVar28->IO).InputQueueCharacters.Size) ||
       ((((pIVar28->IO).KeyCtrl != false || ((pIVar28->IO).KeyShift != false)) ||
        ((pIVar28->IO).KeySuper == true)))) {
      pIVar28->NavWindowingToggleLayer = false;
    }
    bVar30 = bVar52;
    if ((((0.0 <= (GImGui->IO).KeysData[0x283].DownDurationPrev) &&
         ((GImGui->IO).KeysData[0x283].Down == false)) &&
        ((pIVar28->NavWindowingToggleLayer == true &&
         ((pIVar28->ActiveId == 0 || (pIVar28->ActiveIdAllowOverlap == true)))))) &&
       (bVar30 = true,
       (-256000.0 <= (pIVar28->IO).MousePos.x && -256000.0 <= (pIVar28->IO).MousePos.y) !=
       (-256000.0 <= (pIVar28->IO).MousePosPrev.y && -256000.0 <= (pIVar28->IO).MousePosPrev.x))) {
      bVar30 = bVar52;
    }
    bVar52 = bVar30;
    if ((GImGui->IO).KeysData[0x283].Down == false) {
      pIVar28->NavWindowingToggleLayer = false;
    }
  }
  pIVar38 = pIVar28->NavWindowingTarget;
  if ((pIVar38 != (ImGuiWindow *)0x0) && ((pIVar38->Flags & 4) == 0)) {
    IVar56.x = 0.0;
    IVar56.y = 0.0;
    if ((pIVar28->NavInputSource == ImGuiInputSource_Keyboard) && ((pIVar28->IO).KeyShift == false))
    {
      IVar56.x = (float)(int)(GImGui->IO).KeysData[0x202].Down -
                 (float)(int)(GImGui->IO).KeysData[0x201].Down;
      IVar56.y = (float)(int)(GImGui->IO).KeysData[0x204].Down -
                 (float)(int)(GImGui->IO).KeysData[0x203].Down;
    }
    if (pIVar28->NavInputSource == ImGuiInputSource_Gamepad) {
      IVar56 = GetNavInputAmount2d(8,ImGuiInputReadMode_Down,0.0,0.0);
    }
    fVar54 = IVar56.y;
    if (((IVar56.x != 0.0) || (fVar54 != 0.0)) || (NAN(fVar54))) {
      fVar70 = (pIVar28->IO).DisplayFramebufferScale.x;
      fVar74 = (pIVar28->IO).DisplayFramebufferScale.y;
      if (fVar74 <= fVar70) {
        fVar70 = fVar74;
      }
      fVar70 = (float)(int)(fVar70 * (pIVar28->IO).DeltaTime * 800.0);
      pIVar38 = pIVar38->RootWindow;
      local_48.Min.x = (pIVar38->Pos).x + IVar56.x * fVar70;
      local_48.Min.y = (pIVar38->Pos).y + fVar54 * fVar70;
      SetWindowPos(pIVar38,&local_48.Min,1);
      if (((pIVar38->Flags & 0x100) == 0) && (GImGui->SettingsDirtyTimer <= 0.0)) {
        GImGui->SettingsDirtyTimer = (GImGui->IO).IniSavingRate;
      }
      pIVar28->NavDisableMouseHover = true;
    }
  }
  if (pIVar33 != (ImGuiWindow *)0x0) {
    if ((pIVar28->NavWindow == (ImGuiWindow *)0x0) || (pIVar33 != pIVar28->NavWindow->RootWindow)) {
      ClearActiveID();
      pIVar27 = GImGui;
      pIVar27->NavMousePosDirty = true;
      pIVar27->NavDisableHighlight = false;
      pIVar27->NavDisableMouseHover = true;
      pIVar38 = pIVar33->NavLastChildNavWindow;
      if ((pIVar38 == (ImGuiWindow *)0x0) || (pIVar38->WasActive == false)) {
        pIVar38 = pIVar33;
      }
      ClosePopupsOverWindow(pIVar38,false);
      FocusWindow(pIVar38);
      if (pIVar38->NavLastIds[0] == 0) {
        NavInitWindow(pIVar38,false);
      }
      if ((pIVar38->DC).NavLayersActiveMaskNext == 2) {
        pIVar28->NavLayer = ImGuiNavLayer_Menu;
      }
    }
    pIVar28->NavWindowingTarget = (ImGuiWindow *)0x0;
  }
  if ((bVar52) && (pIVar28->NavWindow != (ImGuiWindow *)0x0)) {
    ClearActiveID();
    pIVar33 = pIVar28->NavWindow;
    pIVar38 = pIVar33;
    do {
      window = pIVar38;
      if ((window->ParentWindow == (ImGuiWindow *)0x0) ||
         (((window->DC).NavLayersActiveMask & 2) != 0)) break;
      pIVar38 = window->ParentWindow;
    } while ((window->Flags & 0x15000000U) == 0x1000000);
    if (window != pIVar33) {
      FocusWindow(window);
      window->NavLastChildNavWindow = pIVar33;
    }
    IVar44 = ImGuiNavLayer_Main;
    if (((pIVar28->NavWindow->DC).NavLayersActiveMask & 2) != 0) {
      IVar44 = pIVar28->NavLayer ^ ImGuiNavLayer_Menu;
    }
    if (IVar44 != pIVar28->NavLayer) {
      if (IVar44 == ImGuiNavLayer_Menu) {
        pIVar28->NavWindow->NavLastIds[1] = 0;
      }
      NavRestoreLayer(IVar44);
      pIVar28 = GImGui;
      pIVar28->NavMousePosDirty = true;
      pIVar28->NavDisableHighlight = false;
      pIVar28->NavDisableMouseHover = true;
    }
  }
  cVar48 = (char)uVar35;
  if (((uVar10 & 1) == 0 && cVar48 == '\0') || (pIVar26->NavWindow == (ImGuiWindow *)0x0)) {
    (pIVar26->IO).NavActive = false;
LAB_00110949:
    bVar52 = pIVar26->NavWindowingTarget != (ImGuiWindow *)0x0;
  }
  else {
    bVar52 = (pIVar26->NavWindow->Flags & 0x40000U) == 0;
    (pIVar26->IO).NavActive = bVar52;
    if (((!bVar52) || (pIVar26->NavId == 0)) ||
       (bVar52 = true, pIVar26->NavDisableHighlight != false)) goto LAB_00110949;
  }
  (pIVar26->IO).NavVisible = bVar52;
  pIVar28 = GImGui;
  fVar54 = (GImGui->IO).NavInputsDownDuration[1];
  if ((fVar54 == 0.0) && (!NAN(fVar54))) {
    if (GImGui->ActiveId == 0) {
      if (GImGui->NavLayer == ImGuiNavLayer_Main) {
        pIVar33 = GImGui->NavWindow;
        if (((pIVar33 == (ImGuiWindow *)0x0) || (pIVar33 == pIVar33->RootWindow)) ||
           (((pIVar33->Flags & 0x4000000) != 0 ||
            (pIVar38 = pIVar33->ParentWindow, pIVar38 == (ImGuiWindow *)0x0)))) {
          iVar40 = (GImGui->OpenPopupStack).Size;
          if ((long)iVar40 < 1) {
            if ((pIVar33 != (ImGuiWindow *)0x0) && ((pIVar33->Flags & 0x5000000U) != 0x1000000)) {
              pIVar33->NavLastIds[0] = 0;
            }
            pIVar28->NavId = 0;
            pIVar28->NavFocusScopeId = 0;
          }
          else if ((((GImGui->OpenPopupStack).Data[(long)iVar40 + -1].Window)->Flags & 0x8000000) ==
                   0) {
            ClosePopupToLevel(iVar40 + -1,true);
          }
        }
        else {
          IVar58 = pIVar33->Size;
          fVar74 = (pIVar33->Pos).x;
          fVar72 = (pIVar33->Pos).y;
          FocusWindow(pIVar38);
          pIVar28 = GImGui;
          IVar41 = pIVar33->ChildId;
          IVar56 = (pIVar38->DC).CursorStartPos;
          fVar54 = IVar56.x;
          IVar62.x = fVar74 - fVar54;
          fVar70 = IVar56.y;
          IVar62.y = fVar72 - fVar70;
          IVar66.x = (IVar58.x + fVar74) - fVar54;
          IVar66.y = (IVar58.y + fVar72) - fVar70;
          GImGui->NavId = IVar41;
          pIVar28->NavLayer = ImGuiNavLayer_Main;
          pIVar28->NavFocusScopeId = 0;
          pIVar33 = pIVar28->NavWindow;
          pIVar33->NavLastIds[0] = IVar41;
          pIVar33->NavRectRel[0].Min = IVar62;
          pIVar33->NavRectRel[0].Max = IVar66;
          pIVar28->NavMousePosDirty = true;
          pIVar28->NavDisableHighlight = false;
          pIVar28->NavDisableMouseHover = true;
        }
      }
      else {
        NavRestoreLayer(ImGuiNavLayer_Main);
        pIVar28 = GImGui;
        pIVar28->NavMousePosDirty = true;
        pIVar28->NavDisableHighlight = false;
        pIVar28->NavDisableMouseHover = true;
      }
    }
    else if ((GImGui->ActiveIdUsingNavInputMask & 2) == 0) {
      ClearActiveID();
    }
  }
  pIVar26->NavActivateId = 0;
  pIVar26->NavActivateDownId = 0;
  pIVar26->NavActivatePressedId = 0;
  pIVar26->NavActivateInputId = 0;
  pIVar26->NavActivateFlags = 0;
  IVar41 = pIVar26->NavId;
  if ((((IVar41 != 0) && (pIVar26->NavDisableHighlight == false)) &&
      (pIVar26->NavWindowingTarget == (ImGuiWindow *)0x0)) &&
     ((pIVar26->NavWindow != (ImGuiWindow *)0x0 && ((pIVar26->NavWindow->Flags & 0x40000) == 0)))) {
    fVar54 = (GImGui->IO).NavInputs[0];
    if (0.0 < fVar54) {
      bVar52 = (GImGui->IO).NavInputsDownDuration[0] == 0.0;
    }
    else {
      bVar52 = false;
    }
    if ((GImGui->IO).NavInputs[2] <= 0.0) {
      bVar30 = false;
    }
    else {
      bVar30 = (GImGui->IO).NavInputsDownDuration[2] == 0.0;
    }
    IVar11 = pIVar26->ActiveId;
    if (bVar52 && IVar11 == 0) {
      pIVar26->NavActivateId = IVar41;
      pIVar26->NavActivateFlags = 2;
    }
    if (IVar11 == 0) {
      if (bVar30) goto LAB_0011104b;
    }
    else if ((bool)(bVar30 & IVar11 == IVar41)) {
LAB_0011104b:
      pIVar26->NavActivateInputId = IVar41;
      pIVar26->NavActivateFlags = 1;
    }
    if (IVar11 == 0) {
      if (0.0 < fVar54) goto LAB_00111076;
    }
    else if (IVar11 == IVar41 && 0.0 < fVar54) {
LAB_00111076:
      pIVar26->NavActivateDownId = IVar41;
    }
    if (IVar11 == 0) {
      if (bVar52) goto LAB_001110a6;
    }
    else if ((bool)(bVar52 & IVar11 == IVar41)) {
LAB_001110a6:
      pIVar26->NavActivatePressedId = IVar41;
    }
  }
  if ((pIVar26->NavWindow != (ImGuiWindow *)0x0) && ((pIVar26->NavWindow->Flags & 0x40000) != 0)) {
    pIVar26->NavDisableHighlight = true;
  }
  IVar41 = pIVar26->NavNextActivateId;
  if (IVar41 != 0) {
    if ((pIVar26->NavNextActivateFlags & 1U) == 0) {
      pIVar26->NavActivatePressedId = IVar41;
      pIVar26->NavActivateDownId = IVar41;
      pIVar26->NavActivateId = IVar41;
    }
    else {
      pIVar26->NavActivateInputId = IVar41;
    }
    pIVar26->NavActivateFlags = pIVar26->NavNextActivateFlags;
  }
  pIVar26->NavNextActivateId = 0;
  pIVar28 = GImGui;
  pIVar33 = GImGui->NavWindow;
  if ((GImGui->NavMoveForwardToNextFrame & pIVar33 != (ImGuiWindow *)0x0) == 0) {
    GImGui->NavMoveDir = -1;
    pIVar28->NavMoveFlags = 0;
    pIVar28->NavMoveScrollFlags = 0;
    if (((pIVar33 != (ImGuiWindow *)0x0) && (pIVar28->NavWindowingTarget == (ImGuiWindow *)0x0)) &&
       ((pIVar33->Flags & 0x40000) == 0)) {
      uVar35 = pIVar28->ActiveIdUsingNavDirMask;
      if (((uVar35 & 1) == 0) &&
         ((fVar54 = GetNavInputAmount(4,ImGuiInputReadMode_Repeat), 0.0 < fVar54 ||
          (fVar54 = GetNavInputAmount(0x10,ImGuiInputReadMode_Repeat), 0.0 < fVar54)))) {
        pIVar28->NavMoveDir = 0;
      }
      if (((uVar35 & 2) == 0) &&
         ((fVar54 = GetNavInputAmount(5,ImGuiInputReadMode_Repeat), 0.0 < fVar54 ||
          (fVar54 = GetNavInputAmount(0x11,ImGuiInputReadMode_Repeat), 0.0 < fVar54)))) {
        pIVar28->NavMoveDir = 1;
      }
      if (((uVar35 & 4) == 0) &&
         ((fVar54 = GetNavInputAmount(6,ImGuiInputReadMode_Repeat), 0.0 < fVar54 ||
          (fVar54 = GetNavInputAmount(0x12,ImGuiInputReadMode_Repeat), 0.0 < fVar54)))) {
        pIVar28->NavMoveDir = 2;
      }
      if (((uVar35 & 8) == 0) &&
         ((fVar54 = GetNavInputAmount(7,ImGuiInputReadMode_Repeat), 0.0 < fVar54 ||
          (fVar54 = GetNavInputAmount(0x13,ImGuiInputReadMode_Repeat), 0.0 < fVar54)))) {
        pIVar28->NavMoveDir = 3;
      }
    }
    pIVar28->NavMoveClipDir = pIVar28->NavMoveDir;
    (pIVar28->NavScoringNoClipRect).Min.x = 3.4028235e+38;
    (pIVar28->NavScoringNoClipRect).Min.y = 3.4028235e+38;
    (pIVar28->NavScoringNoClipRect).Max.x = -3.4028235e+38;
    (pIVar28->NavScoringNoClipRect).Max.y = -3.4028235e+38;
  }
  fVar54 = 0.0;
  if ((((pIVar33 != (ImGuiWindow *)0x0) && (pIVar28->NavMoveDir == -1)) &&
      (((pIVar28->IO).ConfigFlags & 1U) != 0)) &&
     (((pIVar33->Flags & 0x40000) == 0 && (pIVar28->NavWindowingTarget == (ImGuiWindow *)0x0)))) {
    bVar52 = false;
    bVar30 = false;
    if ((pIVar28->IO).KeysData[0x205].Down == true) {
      bVar30 = ((pIVar28->ActiveIdUsingKeyInputMask).Storage[0] & 0x20) == 0;
    }
    if ((pIVar28->IO).KeysData[0x206].Down == true) {
      bVar52 = ((pIVar28->ActiveIdUsingKeyInputMask).Storage[0] & 0x40) == 0;
    }
    bVar31 = IsKeyPressed(0x207,true);
    if (bVar31) {
      bVar31 = ((pIVar28->ActiveIdUsingKeyInputMask).Storage[0] & 0x80) == 0;
    }
    else {
      bVar31 = false;
    }
    bVar32 = IsKeyPressed(0x208,true);
    if (bVar32) {
      bVar32 = ((pIVar28->ActiveIdUsingKeyInputMask).Storage[0] & 0x100) == 0;
    }
    else {
      bVar32 = false;
    }
    if ((bVar30 != bVar52) || (fVar54 = 0.0, bVar31 != bVar32)) {
      if (pIVar28->NavLayer != ImGuiNavLayer_Main) {
        NavRestoreLayer(ImGuiNavLayer_Main);
      }
      if (((pIVar33->DC).NavLayersActiveMask == 0) && ((pIVar33->DC).NavHasScroll == true)) {
        bVar52 = IsKeyPressed(0x205,true);
        if (bVar52) {
          fVar54 = (pIVar33->Scroll).y - ((pIVar33->InnerRect).Max.y - (pIVar33->InnerRect).Min.y);
        }
        else {
          bVar52 = IsKeyPressed(0x206,true);
          if (!bVar52) {
            if (bVar31 == false) {
              fVar54 = 0.0;
              if (bVar32 != false) {
                (pIVar33->ScrollTarget).y = (pIVar33->ScrollMax).y;
                (pIVar33->ScrollTargetCenterRatio).y = 0.0;
                (pIVar33->ScrollTargetEdgeSnapDist).y = 0.0;
              }
            }
            else {
              (pIVar33->ScrollTarget).y = 0.0;
              (pIVar33->ScrollTargetCenterRatio).y = 0.0;
              (pIVar33->ScrollTargetEdgeSnapDist).y = 0.0;
              fVar54 = 0.0;
            }
            goto LAB_001111c8;
          }
          fVar54 = ((pIVar33->InnerRect).Max.y - (pIVar33->InnerRect).Min.y) + (pIVar33->Scroll).y;
        }
        (pIVar33->ScrollTarget).y = fVar54;
        (pIVar33->ScrollTargetCenterRatio).y = 0.0;
        (pIVar33->ScrollTargetEdgeSnapDist).y = 0.0;
        fVar54 = 0.0;
      }
      else {
        IVar44 = pIVar28->NavLayer;
        pIVar42 = pIVar33->NavRectRel + IVar44;
        fVar54 = GImGui->FontBaseSize * pIVar33->FontWindowScale;
        if (pIVar33->ParentWindow != (ImGuiWindow *)0x0) {
          fVar54 = fVar54 * pIVar33->ParentWindow->FontWindowScale;
        }
        fVar54 = (pIVar33->NavRectRel[IVar44].Max.y - pIVar33->NavRectRel[IVar44].Min.y) +
                 (((pIVar33->InnerRect).Max.y - (pIVar33->InnerRect).Min.y) - fVar54);
        fVar54 = (float)(~-(uint)(fVar54 <= 0.0) & (uint)fVar54);
        bVar52 = IsKeyPressed(0x205,true);
        if (bVar52) {
          fVar54 = -fVar54;
          pIVar28->NavMoveDir = 3;
          pIVar28->NavMoveClipDir = 2;
          pIVar28->NavMoveFlags = 0x30;
        }
        else {
          bVar52 = IsKeyPressed(0x206,true);
          if (bVar52) {
            pIVar28->NavMoveDir = 2;
            pIVar28->NavMoveClipDir = 3;
            pIVar28->NavMoveFlags = 0x30;
          }
          else {
            if (bVar31 == false) {
              if (bVar32 != false) {
                fVar54 = (pIVar33->ContentSize).y;
                pIVar33->NavRectRel[IVar44].Max.y = fVar54;
                pIVar33->NavRectRel[IVar44].Min.y = fVar54;
                fVar54 = (pIVar42->Min).x;
                pIVar1 = &pIVar33->NavRectRel[IVar44].Max;
                if (pIVar1->x <= fVar54 && fVar54 != pIVar1->x) {
                  pIVar33->NavRectRel[IVar44].Max.x = 0.0;
                  (pIVar42->Min).x = 0.0;
                }
                pIVar28->NavMoveDir = 2;
                pIVar28->NavMoveFlags = 0x50;
              }
            }
            else {
              pIVar33->NavRectRel[IVar44].Max.y = 0.0;
              pIVar33->NavRectRel[IVar44].Min.y = 0.0;
              fVar54 = (pIVar42->Min).x;
              pIVar1 = &pIVar33->NavRectRel[IVar44].Max;
              if (pIVar1->x <= fVar54 && fVar54 != pIVar1->x) {
                pIVar33->NavRectRel[IVar44].Max.x = 0.0;
                (pIVar42->Min).x = 0.0;
              }
              pIVar28->NavMoveDir = 3;
              pIVar28->NavMoveFlags = 0x50;
            }
            fVar54 = 0.0;
          }
        }
      }
    }
  }
LAB_001111c8:
  if ((fVar54 != 0.0) || (NAN(fVar54))) {
    IVar58 = (pIVar33->InnerRect).Max;
    (pIVar28->NavScoringNoClipRect).Min = (pIVar33->InnerRect).Min;
    (pIVar28->NavScoringNoClipRect).Max = IVar58;
    (pIVar28->NavScoringNoClipRect).Min.y = (pIVar28->NavScoringNoClipRect).Min.y + fVar54;
    (pIVar28->NavScoringNoClipRect).Max.y = (pIVar28->NavScoringNoClipRect).Max.y + fVar54;
  }
  pIVar28->NavMoveForwardToNextFrame = false;
  if (pIVar28->NavMoveDir != -1) {
    NavMoveRequestSubmit
              (pIVar28->NavMoveDir,pIVar28->NavMoveClipDir,pIVar28->NavMoveFlags,
               pIVar28->NavMoveScrollFlags);
  }
  if (pIVar28->NavMoveSubmitted == true) {
    if (pIVar28->NavId == 0) {
      pIVar28->NavInitRequest = true;
      pIVar28->NavInitRequestFromMove = true;
      pIVar28->NavInitResultId = 0;
      pIVar28->NavDisableHighlight = false;
    }
    if ((pIVar28->NavInputSource == ImGuiInputSource_Gamepad) &&
       (uVar37 = (ulong)pIVar28->NavLayer, uVar37 == 0 && pIVar33 != (ImGuiWindow *)0x0)) {
      auVar63._0_4_ = -(uint)((pIVar28->NavMoveFlags & 5U) == 0);
      auVar63._4_4_ = -(uint)((pIVar28->NavMoveFlags & 10U) == 0);
      auVar63._8_4_ = 0xffffffff;
      auVar63._12_4_ = 0xffffffff;
      IVar58 = (pIVar33->DC).CursorStartPos;
      IVar56 = (pIVar33->InnerRect).Min;
      IVar61 = (pIVar33->InnerRect).Max;
      fVar70 = IVar58.x;
      local_48.Min.x = (IVar56.x + -1.0) - fVar70;
      fVar74 = IVar58.y;
      local_48.Min.y = (IVar56.y + -1.0) - fVar74;
      fVar70 = (IVar61.x + 1.0) - fVar70;
      fVar74 = (IVar61.y + 1.0) - fVar74;
      local_48.Max.y = fVar74;
      local_48.Max.x = fVar70;
      auVar69._4_4_ = auVar63._4_4_;
      auVar69._0_4_ = auVar63._4_4_;
      auVar69._8_4_ = auVar63._4_4_;
      auVar69._12_4_ = auVar63._4_4_;
      if (((auVar69 | auVar63) & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        if ((((pIVar33->NavRectRel[uVar37].Min.x < local_48.Min.x) ||
             (pIVar33->NavRectRel[uVar37].Min.y < local_48.Min.y)) ||
            (fVar70 < pIVar33->NavRectRel[uVar37].Max.x)) ||
           (fVar74 < pIVar33->NavRectRel[uVar37].Max.y)) {
          fVar75 = GImGui->FontBaseSize * pIVar33->FontWindowScale;
          pIVar38 = pIVar33->ParentWindow;
          fVar72 = fVar75;
          if (pIVar38 != (ImGuiWindow *)0x0) {
            fVar72 = pIVar38->FontWindowScale * fVar75;
          }
          fVar71 = fVar70 - local_48.Min.x;
          if (fVar72 * 0.5 <= fVar70 - local_48.Min.x) {
            fVar71 = fVar72 * 0.5;
          }
          if (pIVar38 != (ImGuiWindow *)0x0) {
            fVar75 = fVar75 * pIVar38->FontWindowScale;
          }
          fVar72 = fVar74 - local_48.Min.y;
          if (fVar75 * 0.5 <= fVar74 - local_48.Min.y) {
            fVar72 = fVar75 * 0.5;
          }
          local_48.Min.y =
               (float)(~auVar63._4_4_ & 0xff7fffff | (uint)(local_48.Min.y + fVar72) & auVar63._4_4_
                      );
          local_48.Min.x =
               (float)(~auVar63._0_4_ & 0xff7fffff | (uint)(local_48.Min.x + fVar71) & auVar63._0_4_
                      );
          local_48.Max.y =
               (float)(~auVar63._4_4_ & 0x7f7fffff | (uint)(fVar74 - fVar72) & auVar63._4_4_);
          local_48.Max.x =
               (float)(~auVar63._0_4_ & 0x7f7fffff | (uint)(fVar70 - fVar71) & auVar63._0_4_);
          ImRect::ClipWithFull(pIVar33->NavRectRel + uVar37,&local_48);
          pIVar28->NavId = 0;
          pIVar28->NavFocusScopeId = 0;
        }
      }
    }
  }
  if (pIVar33 == (ImGuiWindow *)0x0) {
    IVar57.x = 0.0;
    IVar57.y = 0.0;
    IVar67.x = 0.0;
    IVar67.y = 0.0;
  }
  else {
    IVar44 = pIVar28->NavLayer;
    fVar70 = pIVar33->NavRectRel[IVar44].Max.x;
    fVar74 = pIVar33->NavRectRel[IVar44].Min.x;
    fVar72 = pIVar33->NavRectRel[IVar44].Min.y;
    fVar75 = pIVar33->NavRectRel[IVar44].Max.y;
    fVar71 = 0.0;
    fVar73 = 0.0;
    fVar65 = 0.0;
    fVar55 = 0.0;
    if (fVar74 <= fVar70 && fVar72 <= fVar75) {
      fVar71 = fVar72;
      fVar73 = fVar75;
      fVar65 = fVar70;
      fVar55 = fVar74;
    }
    fVar70 = (pIVar33->DC).CursorStartPos.x;
    fVar74 = (pIVar33->DC).CursorStartPos.y;
    fVar65 = fVar65 + fVar70;
    fVar70 = fVar55 + fVar70 + 1.0;
    if (fVar65 <= fVar70) {
      fVar70 = fVar65;
    }
    IVar67.y = fVar71 + fVar74 + fVar54;
    IVar67.x = fVar70;
    IVar57.y = fVar73 + fVar74 + fVar54;
    IVar57.x = fVar70;
  }
  (pIVar28->NavScoringRect).Min = IVar67;
  (pIVar28->NavScoringRect).Max = IVar57;
  if (IVar67.x < (pIVar28->NavScoringNoClipRect).Min.x) {
    (pIVar28->NavScoringNoClipRect).Min.x = IVar67.x;
  }
  if (IVar67.y < (pIVar28->NavScoringNoClipRect).Min.y) {
    (pIVar28->NavScoringNoClipRect).Min.y = IVar67.y;
  }
  pIVar1 = &(pIVar28->NavScoringNoClipRect).Max;
  fVar54 = IVar57.x;
  if (pIVar1->x <= fVar54 && fVar54 != pIVar1->x) {
    (pIVar28->NavScoringNoClipRect).Max.x = fVar54;
  }
  fVar54 = IVar57.y;
  pfVar3 = &(pIVar28->NavScoringNoClipRect).Max.y;
  if (*pfVar3 <= fVar54 && fVar54 != *pfVar3) {
    (pIVar28->NavScoringNoClipRect).Max.y = fVar54;
  }
  pIVar28 = GImGui;
  if ((((pIVar26->NavMoveDir == -1) && (pIVar33 = GImGui->NavWindow, pIVar33 != (ImGuiWindow *)0x0))
      && ((GImGui->NavWindowingTarget == (ImGuiWindow *)0x0 &&
          (((pIVar33->Flags & 0x40000) == 0 && (bVar52 = IsKeyPressed(0x200,true), bVar52)))))) &&
     ((((pIVar28->ActiveIdUsingKeyInputMask).Storage[0] & 1) == 0 &&
      (((pIVar28->IO).KeyCtrl == false && ((pIVar28->IO).KeyAlt == false)))))) {
    uVar35 = 0xffffffff;
    if ((pIVar28->IO).KeyShift == false) {
      uVar35 = (uint)(pIVar28->ActiveId != 0);
    }
    pIVar28->NavTabbingDir = uVar35;
    scroll_flags = 3;
    if (pIVar33->Appearing != false) {
      scroll_flags = 0x21;
    }
    NavMoveRequestSubmit(-1,uVar35 >> 0x1f ^ 3,0x400,scroll_flags);
    (pIVar28->NavTabbingResultFirst).InFlags = 0;
    (pIVar28->NavTabbingResultFirst).Window = (ImGuiWindow *)0x0;
    (pIVar28->NavTabbingResultFirst).ID = 0;
    (pIVar28->NavTabbingResultFirst).FocusScopeId = 0;
    (pIVar28->NavTabbingResultFirst).DistAxial = 3.4028235e+38;
    (pIVar28->NavTabbingResultFirst).DistBox = 3.4028235e+38;
    (pIVar28->NavTabbingResultFirst).DistCenter = 3.4028235e+38;
    pIVar28->NavTabbingCounter = -1;
  }
  pIVar28 = GImGui;
  bVar52 = true;
  if (GImGui->NavMoveScoringItems == false) {
    bVar52 = GImGui->NavInitRequest;
  }
  GImGui->NavAnyRequest = bVar52;
  pIVar26->NavIdIsAlive = false;
  pIVar33 = pIVar26->NavWindow;
  if (((pIVar33 != (ImGuiWindow *)0x0) && ((pIVar33->Flags & 0x40000) == 0)) &&
     (pIVar26->NavWindowingTarget == (ImGuiWindow *)0x0)) {
    fVar54 = pIVar28->FontBaseSize * pIVar33->FontWindowScale;
    if (pIVar33->ParentWindow != (ImGuiWindow *)0x0) {
      fVar54 = fVar54 * pIVar33->ParentWindow->FontWindowScale;
    }
    fVar54 = (float)(int)(fVar54 * 100.0 * (pIVar26->IO).DeltaTime + 0.5);
    if (((pIVar33->DC).NavLayersActiveMask == 0) &&
       (uVar35 = pIVar26->NavMoveDir, (uVar35 != 0xffffffff & (pIVar33->DC).NavHasScroll) == 1)) {
      if (uVar35 < 2) {
        (pIVar33->ScrollTarget).x =
             (float)(int)(*(float *)(&DAT_0017c0d0 + (ulong)(uVar35 == 0) * 4) * fVar54 +
                         (pIVar33->Scroll).x);
        (pIVar33->ScrollTargetCenterRatio).x = 0.0;
        (pIVar33->ScrollTargetEdgeSnapDist).x = 0.0;
      }
      if ((uVar35 & 0xfffffffe) == 2) {
        (pIVar33->ScrollTarget).y =
             (float)(int)(*(float *)(&DAT_0017c0d0 + (ulong)(uVar35 == 2) * 4) * fVar54 +
                         (pIVar33->Scroll).y);
        (pIVar33->ScrollTargetCenterRatio).y = 0.0;
        (pIVar33->ScrollTargetEdgeSnapDist).y = 0.0;
      }
    }
    IVar58 = GetNavInputAmount2d(8,ImGuiInputReadMode_Down,0.1,10.0);
    fVar70 = IVar58.x;
    fVar74 = IVar58.y;
    if (((fVar70 != 0.0) || (NAN(fVar70))) && (pIVar33->ScrollbarX == true)) {
      (pIVar33->ScrollTarget).x = (float)(int)(fVar70 * fVar54 + (pIVar33->Scroll).x);
      (pIVar33->ScrollTargetCenterRatio).x = 0.0;
      (pIVar33->ScrollTargetEdgeSnapDist).x = 0.0;
    }
    if ((fVar74 != 0.0) || (NAN(fVar74))) {
      (pIVar33->ScrollTarget).y = (float)(int)(fVar74 * fVar54 + (pIVar33->Scroll).y);
      (pIVar33->ScrollTargetCenterRatio).y = 0.0;
      (pIVar33->ScrollTargetEdgeSnapDist).y = 0.0;
    }
  }
  if ((uVar10 & 1) == 0 && cVar48 == '\0') {
    pIVar26->NavDisableHighlight = true;
    pIVar26->NavDisableMouseHover = false;
  }
  else if (((bVar51) && (((pIVar26->IO).ConfigFlags & 4) != 0)) &&
          (((pIVar26->IO).BackendFlags & 4) != 0)) {
    IVar58 = NavCalcPreferredRefPos();
    (pIVar26->IO).MousePosPrev = IVar58;
    (pIVar26->IO).MousePos = IVar58;
    (pIVar26->IO).WantSetMousePos = true;
  }
  pIVar26->NavScoringDebugCount = 0;
  pIVar26 = GImGui;
  fVar54 = (GImGui->IO).MousePos.x;
  if ((-256000.0 <= fVar54) && (fVar70 = (GImGui->IO).MousePos.y, -256000.0 <= fVar70)) {
    if (0.0 <= fVar54) {
LAB_001117ac:
      iVar40 = (int)fVar54;
    }
    else {
      if ((fVar54 == (float)(int)fVar54) && (!NAN(fVar54) && !NAN((float)(int)fVar54)))
      goto LAB_001117ac;
      iVar40 = (int)fVar54 + -1;
    }
    if (0.0 <= fVar70) {
LAB_001117ce:
      iVar36 = (int)fVar70;
    }
    else {
      if ((fVar70 == (float)(int)fVar70) && (!NAN(fVar70) && !NAN((float)(int)fVar70)))
      goto LAB_001117ce;
      iVar36 = (int)fVar70 + -1;
    }
    IVar59.x = (float)iVar40;
    IVar59.y = (float)iVar36;
    GImGui->MouseLastValidPos = IVar59;
    (pIVar26->IO).MousePos = IVar59;
  }
  IVar58 = (pIVar26->IO).MousePos;
  fVar54 = IVar58.x;
  fVar70 = IVar58.y;
  if ((-256000.0 <= fVar54) && (-256000.0 <= fVar70)) {
    IVar58 = (pIVar26->IO).MousePosPrev;
    fVar74 = IVar58.x;
    if ((-256000.0 <= fVar74) && (fVar72 = IVar58.y, -256000.0 <= fVar72)) {
      IVar23.y = fVar70 - fVar72;
      IVar23.x = fVar54 - fVar74;
      (pIVar26->IO).MouseDelta = IVar23;
      goto LAB_0011184b;
    }
  }
  (pIVar26->IO).MouseDelta.x = 0.0;
  (pIVar26->IO).MouseDelta.y = 0.0;
LAB_0011184b:
  if ((((pIVar26->IO).MouseDelta.x != 0.0) || (fVar54 = (pIVar26->IO).MouseDelta.y, fVar54 != 0.0))
     || (NAN(fVar54))) {
    pIVar26->NavDisableMouseHover = false;
  }
  IVar58 = (pIVar26->IO).MousePos;
  (pIVar26->IO).MousePosPrev = IVar58;
  lVar49 = 0;
  do {
    bVar51 = (pIVar26->IO).MouseDown[lVar49];
    if (bVar51 == true) {
      pfVar3 = (pIVar26->IO).MouseDownDuration + lVar49;
      bVar52 = *pfVar3 <= 0.0 && *pfVar3 != 0.0;
    }
    else {
      bVar52 = false;
    }
    (pIVar26->IO).MouseClicked[lVar49] = bVar52;
    (pIVar26->IO).MouseClickedCount[lVar49] = 0;
    if (bVar51 == false) {
      bVar30 = 0.0 <= (pIVar26->IO).MouseDownDuration[lVar49];
    }
    else {
      bVar30 = false;
    }
    (pIVar26->IO).MouseReleased[lVar49] = bVar30;
    fVar54 = (pIVar26->IO).MouseDownDuration[lVar49];
    (pIVar26->IO).MouseDownDurationPrev[lVar49] = fVar54;
    fVar74 = -1.0;
    if ((bVar51 != false) && (fVar74 = 0.0, 0.0 <= fVar54)) {
      fVar74 = fVar54 + (pIVar26->IO).DeltaTime;
    }
    (pIVar26->IO).MouseDownDuration[lVar49] = fVar74;
    if (bVar52 == false) {
      if (bVar51 != false) {
        fVar54 = (pIVar26->IO).MousePos.x;
        fVar74 = 0.0;
        if ((-256000.0 <= fVar54) && (-256000.0 <= fVar70)) {
          fVar54 = fVar54 - (pIVar26->IO).MouseClickedPos[lVar49].x;
          fVar74 = fVar70 - (pIVar26->IO).MouseClickedPos[lVar49].y;
          fVar74 = fVar54 * fVar54 + fVar74 * fVar74;
        }
        fVar54 = (pIVar26->IO).MouseDragMaxDistanceSqr[lVar49];
        uVar35 = -(uint)(fVar74 <= fVar54);
        (pIVar26->IO).MouseDragMaxDistanceSqr[lVar49] =
             (float)(~uVar35 & (uint)fVar74 | (uint)fVar54 & uVar35);
      }
    }
    else {
      dVar9 = pIVar26->Time;
      if ((pIVar26->IO).MouseDoubleClickTime <=
          (float)(dVar9 - (pIVar26->IO).MouseClickedTime[lVar49])) {
LAB_001119ff:
        (pIVar26->IO).MouseClickedLastCount[lVar49] = 1;
      }
      else {
        fVar54 = (pIVar26->IO).MousePos.x;
        fVar74 = 0.0;
        fVar72 = 0.0;
        if ((-256000.0 <= fVar54) && (-256000.0 <= fVar70)) {
          IVar56 = (pIVar26->IO).MouseClickedPos[lVar49];
          fVar74 = fVar54 - IVar56.x;
          fVar72 = fVar70 - IVar56.y;
        }
        fVar54 = (pIVar26->IO).MouseDoubleClickMaxDist;
        if (fVar54 * fVar54 <= fVar74 * fVar74 + fVar72 * fVar72) goto LAB_001119ff;
        pIVar8 = (pIVar26->IO).MouseClickedLastCount + lVar49;
        *pIVar8 = *pIVar8 + 1;
      }
      (pIVar26->IO).MouseClickedTime[lVar49] = dVar9;
      (pIVar26->IO).MouseClickedPos[lVar49] = IVar58;
      (pIVar26->IO).MouseClickedCount[lVar49] = (pIVar26->IO).MouseClickedLastCount[lVar49];
      (pIVar26->IO).MouseDragMaxDistanceSqr[lVar49] = 0.0;
    }
    (pIVar26->IO).MouseDoubleClicked[lVar49] = (pIVar26->IO).MouseClickedCount[lVar49] == 2;
    if ((pIVar26->IO).MouseClicked[lVar49] == true) {
      pIVar26->NavDisableMouseHover = false;
    }
    lVar49 = lVar49 + 1;
    if (lVar49 == 5) {
      UpdateHoveredWindowAndCaptureFlags();
      UpdateMouseMovingWindowNewFrame();
      pIVar33 = GetTopMostPopupModal();
      if ((pIVar33 != (ImGuiWindow *)0x0) ||
         ((pIVar25->NavWindowingTarget != (ImGuiWindow *)0x0 &&
          (0.0 < pIVar25->NavWindowingHighlightAlpha)))) {
        fVar54 = (pIVar25->IO).DeltaTime * 6.0 + pIVar25->DimBgRatio;
        if (1.0 <= fVar54) {
          fVar54 = 1.0;
        }
        pIVar25->DimBgRatio = fVar54;
      }
      else {
        fVar54 = (pIVar25->IO).DeltaTime * -10.0 + pIVar25->DimBgRatio;
        pIVar25->DimBgRatio = (float)(-(uint)(0.0 <= fVar54) & (uint)fVar54);
      }
      pIVar25->MouseCursor = 0;
      pIVar25->WantTextInputNextFrame = -1;
      pIVar25->WantCaptureMouseNextFrame = -1;
      pIVar25->WantCaptureKeyboardNextFrame = -1;
      uVar29 = *(undefined3 *)&(pIVar25->PlatformImeData).field_0x1;
      fVar54 = (pIVar25->PlatformImeData).InputPos.x;
      uVar24 = *(undefined8 *)&(pIVar25->PlatformImeData).InputPos.y;
      (pIVar25->PlatformImeDataPrev).WantVisible = (pIVar25->PlatformImeData).WantVisible;
      *(undefined3 *)&(pIVar25->PlatformImeDataPrev).field_0x1 = uVar29;
      (pIVar25->PlatformImeDataPrev).InputPos.x = fVar54;
      *(undefined8 *)&(pIVar25->PlatformImeDataPrev).InputPos.y = uVar24;
      (pIVar25->PlatformImeData).WantVisible = false;
      pIVar26 = GImGui;
      if (GImGui->WheelingWindow != (ImGuiWindow *)0x0) {
        GImGui->WheelingWindowTimer = GImGui->WheelingWindowTimer - (GImGui->IO).DeltaTime;
        fVar54 = (pIVar26->IO).MousePos.x;
        if (((-256000.0 <= fVar54) && (fVar70 = (pIVar26->IO).MousePos.y, -256000.0 <= fVar70)) &&
           (fVar54 = fVar54 - (pIVar26->WheelingWindowRefMousePos).x,
           fVar70 = fVar70 - (pIVar26->WheelingWindowRefMousePos).y,
           fVar74 = (pIVar26->IO).MouseDragThreshold,
           fVar74 * fVar74 < fVar54 * fVar54 + fVar70 * fVar70)) {
          pIVar26->WheelingWindowTimer = 0.0;
        }
        if (pIVar26->WheelingWindowTimer <= 0.0) {
          pIVar26->WheelingWindow = (ImGuiWindow *)0x0;
          pIVar26->WheelingWindowTimer = 0.0;
        }
      }
      fVar54 = (pIVar26->IO).MouseWheel;
      if (((((fVar54 != 0.0) || (fVar70 = (pIVar26->IO).MouseWheelH, fVar70 != 0.0)) ||
           (NAN(fVar70))) &&
          ((pIVar26->ActiveId == 0 || (pIVar26->ActiveIdUsingMouseWheel == false)))) &&
         ((pIVar26->HoveredIdPreviousFrame == 0 ||
          (pIVar26->HoveredIdPreviousFrameUsingMouseWheel == false)))) {
        pIVar33 = pIVar26->WheelingWindow;
        pIVar38 = pIVar33;
        if (pIVar33 == (ImGuiWindow *)0x0) {
          pIVar38 = pIVar26->HoveredWindow;
        }
        if ((pIVar38 != (ImGuiWindow *)0x0) && (pIVar38->Collapsed == false)) {
          if (((fVar54 == 0.0) && (!NAN(fVar54))) ||
             (((pIVar26->IO).KeyCtrl != true || ((pIVar26->IO).FontAllowUserScaling != true)))) {
            if ((pIVar26->IO).KeyCtrl == false) {
              if ((pIVar26->IO).KeyShift == true) {
                bVar39 = (pIVar26->IO).ConfigMacOSXBehaviors ^ 1;
              }
              else {
                bVar39 = 0;
              }
              fVar70 = 0.0;
              if (bVar39 == 0) {
                fVar70 = fVar54;
              }
              fVar54 = (pIVar26->IO).NavInputs[(ulong)(bVar39 ^ 1) - 3];
              if ((fVar70 != 0.0) || (NAN(fVar70))) {
                if (pIVar33 != pIVar38) {
                  pIVar26->WheelingWindow = pIVar38;
                  pIVar26->WheelingWindowRefMousePos = (pIVar26->IO).MousePos;
                  pIVar26->WheelingWindowTimer = 2.0;
                }
                while ((uVar35 = pIVar38->Flags, (uVar35 >> 0x18 & 1) != 0 &&
                       (((uVar35 & 0x210) == 0x10 ||
                        ((fVar74 = (pIVar38->ScrollMax).y, fVar74 == 0.0 && (!NAN(fVar74)))))))) {
                  pIVar38 = pIVar38->ParentWindow;
                }
                if ((uVar35 & 0x210) == 0) {
                  fVar74 = ((pIVar38->InnerRect).Max.y - (pIVar38->InnerRect).Min.y) * 0.67;
                  fVar72 = pIVar26->FontBaseSize * pIVar38->FontWindowScale;
                  if (pIVar38->ParentWindow != (ImGuiWindow *)0x0) {
                    fVar72 = fVar72 * pIVar38->ParentWindow->FontWindowScale;
                  }
                  fVar75 = fVar72 * 5.0;
                  if (fVar74 <= fVar72 * 5.0) {
                    fVar75 = fVar74;
                  }
                  (pIVar38->ScrollTarget).y = (pIVar38->Scroll).y - fVar70 * (float)(int)fVar75;
                  (pIVar38->ScrollTargetCenterRatio).y = 0.0;
                  (pIVar38->ScrollTargetEdgeSnapDist).y = 0.0;
                }
              }
              if ((fVar54 != 0.0) || (NAN(fVar54))) {
                if (pIVar26->WheelingWindow != pIVar38) {
                  pIVar26->WheelingWindow = pIVar38;
                  pIVar26->WheelingWindowRefMousePos = (pIVar26->IO).MousePos;
                  pIVar26->WheelingWindowTimer = 2.0;
                }
                while ((uVar35 = pIVar38->Flags, (uVar35 >> 0x18 & 1) != 0 &&
                       (((uVar35 & 0x210) == 0x10 ||
                        ((fVar70 = (pIVar38->ScrollMax).x, fVar70 == 0.0 && (!NAN(fVar70)))))))) {
                  pIVar38 = pIVar38->ParentWindow;
                }
                if ((uVar35 & 0x210) == 0) {
                  fVar70 = ((pIVar38->InnerRect).Max.x - (pIVar38->InnerRect).Min.x) * 0.67;
                  fVar74 = pIVar26->FontBaseSize * pIVar38->FontWindowScale;
                  if (pIVar38->ParentWindow != (ImGuiWindow *)0x0) {
                    fVar74 = fVar74 * pIVar38->ParentWindow->FontWindowScale;
                  }
                  fVar72 = fVar74 + fVar74;
                  if (fVar70 <= fVar74 + fVar74) {
                    fVar72 = fVar70;
                  }
                  (pIVar38->ScrollTarget).x = (pIVar38->Scroll).x - fVar54 * (float)(int)fVar72;
                  (pIVar38->ScrollTargetCenterRatio).x = 0.0;
                  (pIVar38->ScrollTargetEdgeSnapDist).x = 0.0;
                }
              }
            }
          }
          else {
            if (pIVar33 != pIVar38) {
              pIVar26->WheelingWindow = pIVar38;
              pIVar26->WheelingWindowRefMousePos = (pIVar26->IO).MousePos;
              pIVar26->WheelingWindowTimer = 2.0;
            }
            fVar54 = pIVar38->FontWindowScale;
            fVar74 = (pIVar26->IO).MouseWheel * 0.1 + fVar54;
            fVar70 = 2.5;
            if (fVar74 <= 2.5) {
              fVar70 = fVar74;
            }
            fVar70 = (float)(-(uint)(fVar74 < 0.5) & 0x3f000000 |
                            ~-(uint)(fVar74 < 0.5) & (uint)fVar70);
            pIVar38->FontWindowScale = fVar70;
            if (pIVar38 == pIVar38->RootWindow) {
              fVar70 = fVar70 / fVar54;
              IVar58 = pIVar38->Size;
              auVar64._8_8_ = 0;
              auVar64._0_4_ = IVar58.x;
              auVar64._4_4_ = IVar58.y;
              IVar56 = (pIVar26->IO).MousePos;
              fVar54 = (pIVar38->Pos).x;
              fVar74 = (pIVar38->Pos).y;
              auVar68._0_4_ = (IVar56.x - fVar54) * (1.0 - fVar70) * IVar58.x;
              auVar68._4_4_ = (IVar56.y - fVar74) * (1.0 - fVar70) * IVar58.y;
              auVar68._8_8_ = 0;
              auVar69 = divps(auVar68,auVar64);
              local_48.Min.x = auVar69._0_4_ + fVar54;
              local_48.Min.y = auVar69._4_4_ + fVar74;
              SetWindowPos(pIVar38,&local_48.Min,0);
              IVar58 = pIVar38->SizeFull;
              IVar60.x = (float)(int)((pIVar38->Size).x * fVar70);
              IVar60.y = (float)(int)((pIVar38->Size).y * fVar70);
              pIVar38->Size = IVar60;
              (pIVar38->SizeFull).x = (float)(int)(IVar58.x * fVar70);
              (pIVar38->SizeFull).y = (float)(int)(IVar58.y * fVar70);
            }
          }
        }
      }
      local_78 = 3.4028235e+38;
      if ((pIVar25->GcCompactAll == false) &&
         (fVar54 = (pIVar25->IO).ConfigMemoryCompactTimer, 0.0 <= fVar54)) {
        local_78 = (float)pIVar25->Time - fVar54;
      }
      if ((pIVar25->Windows).Size != 0) {
        uVar37 = 0;
        do {
          pIVar33 = (pIVar25->Windows).Data[uVar37];
          bVar51 = pIVar33->Active;
          pIVar33->WasActive = bVar51;
          pIVar33->BeginCount = 0;
          pIVar33->Active = false;
          pIVar33->WriteAccessed = false;
          if (((bVar51 == false) && (pIVar33->MemoryCompacted == false)) &&
             (pIVar33->LastTimeActive <= local_78 && local_78 != pIVar33->LastTimeActive)) {
            GcCompactTransientWindowBuffers(pIVar33);
          }
          uVar37 = uVar37 + 1;
        } while (uVar37 != (uint)(pIVar25->Windows).Size);
      }
      if (0 < (pIVar25->TablesLastTimeActive).Size) {
        lVar49 = 0;
        lVar47 = 0;
        do {
          fVar54 = (pIVar25->TablesLastTimeActive).Data[lVar47];
          if ((0.0 <= fVar54) && (fVar54 < local_78)) {
            TableGcCompactTransientBuffers
                      ((ImGuiTable *)((long)&((pIVar25->Tables).Buf.Data)->ID + lVar49));
          }
          lVar47 = lVar47 + 1;
          lVar49 = lVar49 + 0x208;
        } while (lVar47 < (pIVar25->TablesLastTimeActive).Size);
      }
      if (0 < (pIVar25->TablesTempData).Size) {
        lVar49 = 0;
        lVar47 = 0;
        do {
          pIVar17 = (pIVar25->TablesTempData).Data;
          fVar54 = *(float *)((long)&pIVar17->LastTimeActive + lVar49);
          if ((0.0 <= fVar54) && (fVar54 < local_78)) {
            TableGcCompactTransientBuffers
                      ((ImGuiTableTempData *)((long)&pIVar17->TableIndex + lVar49));
          }
          lVar47 = lVar47 + 1;
          lVar49 = lVar49 + 0x70;
        } while (lVar47 < (pIVar25->TablesTempData).Size);
      }
      if (pIVar25->GcCompactAll != false) {
        GcCompactTransientMiscBuffers();
      }
      pIVar25->GcCompactAll = false;
      if ((pIVar25->NavWindow != (ImGuiWindow *)0x0) && (pIVar25->NavWindow->WasActive == false)) {
        FocusTopMostWindowUnderOne((ImGuiWindow *)0x0,(ImGuiWindow *)0x0);
      }
      iVar40 = (pIVar25->CurrentWindowStack).Capacity;
      if (iVar40 < 0) {
        uVar35 = iVar40 / 2 + iVar40;
        uVar37 = 0;
        if (0 < (int)uVar35) {
          uVar37 = (ulong)uVar35;
        }
        if (GImGui != (ImGuiContext *)0x0) {
          piVar20 = &(GImGui->IO).MetricsActiveAllocations;
          *piVar20 = *piVar20 + 1;
        }
        __dest_01 = (ImGuiWindowStackData *)
                    (*GImAllocatorAllocFunc)(uVar37 * 0x58,GImAllocatorUserData);
        pIVar18 = (pIVar25->CurrentWindowStack).Data;
        if (pIVar18 != (ImGuiWindowStackData *)0x0) {
          memcpy(__dest_01,pIVar18,(long)(pIVar25->CurrentWindowStack).Size * 0x58);
          pIVar18 = (pIVar25->CurrentWindowStack).Data;
          if ((pIVar18 != (ImGuiWindowStackData *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
            piVar20 = &(GImGui->IO).MetricsActiveAllocations;
            *piVar20 = *piVar20 + -1;
          }
          (*GImAllocatorFreeFunc)(pIVar18,GImAllocatorUserData);
        }
        (pIVar25->CurrentWindowStack).Data = __dest_01;
        (pIVar25->CurrentWindowStack).Capacity = (int)uVar37;
      }
      (pIVar25->CurrentWindowStack).Size = 0;
      iVar40 = (pIVar25->BeginPopupStack).Capacity;
      if (iVar40 < 0) {
        uVar35 = iVar40 / 2 + iVar40;
        uVar37 = 0;
        if (0 < (int)uVar35) {
          uVar37 = (ulong)uVar35;
        }
        if (GImGui != (ImGuiContext *)0x0) {
          piVar20 = &(GImGui->IO).MetricsActiveAllocations;
          *piVar20 = *piVar20 + 1;
        }
        __dest_02 = (ImGuiPopupData *)(*GImAllocatorAllocFunc)(uVar37 * 0x30,GImAllocatorUserData);
        pIVar19 = (pIVar25->BeginPopupStack).Data;
        if (pIVar19 != (ImGuiPopupData *)0x0) {
          memcpy(__dest_02,pIVar19,(long)(pIVar25->BeginPopupStack).Size * 0x30);
          pIVar19 = (pIVar25->BeginPopupStack).Data;
          if ((pIVar19 != (ImGuiPopupData *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
            piVar20 = &(GImGui->IO).MetricsActiveAllocations;
            *piVar20 = *piVar20 + -1;
          }
          (*GImAllocatorFreeFunc)(pIVar19,GImAllocatorUserData);
        }
        (pIVar25->BeginPopupStack).Data = __dest_02;
        (pIVar25->BeginPopupStack).Capacity = (int)uVar37;
      }
      (pIVar25->BeginPopupStack).Size = 0;
      iVar40 = (pIVar25->ItemFlagsStack).Capacity;
      if (iVar40 < 0) {
        uVar35 = iVar40 / 2 + iVar40;
        uVar37 = 0;
        if (0 < (int)uVar35) {
          uVar37 = (ulong)uVar35;
        }
        if (GImGui != (ImGuiContext *)0x0) {
          piVar20 = &(GImGui->IO).MetricsActiveAllocations;
          *piVar20 = *piVar20 + 1;
        }
        piVar34 = (int *)(*GImAllocatorAllocFunc)(uVar37 * 4,GImAllocatorUserData);
        piVar20 = (pIVar25->ItemFlagsStack).Data;
        if (piVar20 != (int *)0x0) {
          memcpy(piVar34,piVar20,(long)(pIVar25->ItemFlagsStack).Size << 2);
          piVar20 = (pIVar25->ItemFlagsStack).Data;
          if ((piVar20 != (int *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
            piVar5 = &(GImGui->IO).MetricsActiveAllocations;
            *piVar5 = *piVar5 + -1;
          }
          (*GImAllocatorFreeFunc)(piVar20,GImAllocatorUserData);
        }
        (pIVar25->ItemFlagsStack).Data = piVar34;
        (pIVar25->ItemFlagsStack).Capacity = (int)uVar37;
      }
      (pIVar25->ItemFlagsStack).Size = 0;
      if ((pIVar25->ItemFlagsStack).Capacity == 0) {
        if (GImGui != (ImGuiContext *)0x0) {
          piVar20 = &(GImGui->IO).MetricsActiveAllocations;
          *piVar20 = *piVar20 + 1;
        }
        piVar34 = (int *)(*GImAllocatorAllocFunc)(0x20,GImAllocatorUserData);
        piVar20 = (pIVar25->ItemFlagsStack).Data;
        if (piVar20 != (int *)0x0) {
          memcpy(piVar34,piVar20,(long)(pIVar25->ItemFlagsStack).Size << 2);
          piVar20 = (pIVar25->ItemFlagsStack).Data;
          if ((piVar20 != (int *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
            piVar5 = &(GImGui->IO).MetricsActiveAllocations;
            *piVar5 = *piVar5 + -1;
          }
          (*GImAllocatorFreeFunc)(piVar20,GImAllocatorUserData);
        }
        (pIVar25->ItemFlagsStack).Data = piVar34;
        (pIVar25->ItemFlagsStack).Capacity = 8;
      }
      (pIVar25->ItemFlagsStack).Data[(pIVar25->ItemFlagsStack).Size] = 0;
      (pIVar25->ItemFlagsStack).Size = (pIVar25->ItemFlagsStack).Size + 1;
      iVar40 = (pIVar25->GroupStack).Capacity;
      if (iVar40 < 0) {
        uVar35 = iVar40 / 2 + iVar40;
        uVar37 = 0;
        if (0 < (int)uVar35) {
          uVar37 = (ulong)uVar35;
        }
        if (GImGui != (ImGuiContext *)0x0) {
          piVar20 = &(GImGui->IO).MetricsActiveAllocations;
          *piVar20 = *piVar20 + 1;
        }
        __dest_03 = (ImGuiGroupData *)(*GImAllocatorAllocFunc)(uVar37 * 0x30,GImAllocatorUserData);
        pIVar21 = (pIVar25->GroupStack).Data;
        if (pIVar21 != (ImGuiGroupData *)0x0) {
          memcpy(__dest_03,pIVar21,(long)(pIVar25->GroupStack).Size * 0x30);
          pIVar21 = (pIVar25->GroupStack).Data;
          if ((pIVar21 != (ImGuiGroupData *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
            piVar20 = &(GImGui->IO).MetricsActiveAllocations;
            *piVar20 = *piVar20 + -1;
          }
          (*GImAllocatorFreeFunc)(pIVar21,GImAllocatorUserData);
        }
        (pIVar25->GroupStack).Data = __dest_03;
        (pIVar25->GroupStack).Capacity = (int)uVar37;
      }
      (pIVar25->GroupStack).Size = 0;
      pIVar26 = GImGui;
      GImGui->DebugItemPickerBreakId = 0;
      if (pIVar26->DebugItemPickerActive == true) {
        uVar35 = pIVar26->HoveredIdPreviousFrame;
        pIVar26->MouseCursor = 7;
        bVar51 = IsKeyPressed(0x20e,true);
        if (bVar51) {
          pIVar26->DebugItemPickerActive = false;
        }
        if (uVar35 != 0 && (pIVar26->IO).MouseDownDuration[0] == 0.0) {
          pIVar26->DebugItemPickerBreakId = uVar35;
          pIVar26->DebugItemPickerActive = false;
        }
        *(byte *)&(pIVar26->NextWindowData).Flags = (byte)(pIVar26->NextWindowData).Flags | 0x40;
        (pIVar26->NextWindowData).BgAlphaVal = 0.6;
        BeginTooltipEx(0,0);
        Text("HoveredId: 0x%08X",(ulong)uVar35);
        Text("Press ESC to abort picking.");
        TextColored((GImGui->Style).Colors + (uVar35 == 0),"Click to break in debugger!");
        End();
      }
      pIVar26 = GImGui;
      GImGui->DebugHookIdInfo = 0;
      if (pIVar26->FrameCount == (pIVar26->DebugStackTool).LastActiveFrame + 1) {
        IVar41 = pIVar26->HoveredIdPreviousFrame;
        if (IVar41 == 0) {
          IVar41 = pIVar26->ActiveId;
        }
        if ((pIVar26->DebugStackTool).QueryId != IVar41) {
          (pIVar26->DebugStackTool).QueryId = IVar41;
          (pIVar26->DebugStackTool).StackLevel = -1;
          iVar40 = (pIVar26->DebugStackTool).Results.Capacity;
          if (iVar40 < 0) {
            uVar35 = iVar40 / 2 + iVar40;
            uVar37 = 0;
            if (0 < (int)uVar35) {
              uVar37 = (ulong)uVar35;
            }
            if (pIVar26 != (ImGuiContext *)0x0) {
              piVar20 = &(pIVar26->IO).MetricsActiveAllocations;
              *piVar20 = *piVar20 + 1;
            }
            __dest_04 = (ImGuiStackLevelInfo *)
                        (*GImAllocatorAllocFunc)(uVar37 << 6,GImAllocatorUserData);
            pIVar22 = (pIVar26->DebugStackTool).Results.Data;
            if (pIVar22 != (ImGuiStackLevelInfo *)0x0) {
              memcpy(__dest_04,pIVar22,(long)(pIVar26->DebugStackTool).Results.Size << 6);
              pIVar22 = (pIVar26->DebugStackTool).Results.Data;
              if ((pIVar22 != (ImGuiStackLevelInfo *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
                piVar20 = &(GImGui->IO).MetricsActiveAllocations;
                *piVar20 = *piVar20 + -1;
              }
              (*GImAllocatorFreeFunc)(pIVar22,GImAllocatorUserData);
            }
            (pIVar26->DebugStackTool).Results.Data = __dest_04;
            (pIVar26->DebugStackTool).Results.Capacity = (int)uVar37;
          }
          (pIVar26->DebugStackTool).Results.Size = 0;
        }
        if (IVar41 != 0) {
          iVar40 = (pIVar26->DebugStackTool).StackLevel;
          lVar49 = (long)iVar40;
          if ((-1 < lVar49) && (iVar40 < (pIVar26->DebugStackTool).Results.Size)) {
            pIVar22 = (pIVar26->DebugStackTool).Results.Data;
            if ((pIVar22[lVar49].QuerySuccess != false) ||
               ('\x02' < pIVar22[lVar49].QueryFrameCount)) {
              (pIVar26->DebugStackTool).StackLevel = iVar40 + 1;
            }
          }
          uVar35 = (pIVar26->DebugStackTool).StackLevel;
          uVar37 = (ulong)uVar35;
          if (uVar37 == 0xffffffff) {
            pIVar26->DebugHookIdInfo = IVar41;
          }
          if ((-1 < (int)uVar35) && ((int)uVar35 < (pIVar26->DebugStackTool).Results.Size)) {
            pIVar22 = (pIVar26->DebugStackTool).Results.Data;
            pIVar26->DebugHookIdInfo = pIVar22[uVar37].ID;
            pIVar6 = &pIVar22[uVar37].QueryFrameCount;
            *pIVar6 = *pIVar6 + '\x01';
          }
        }
      }
      pIVar25->WithinFrameScopeWithImplicitWindow = true;
      pIVar26 = GImGui;
      (GImGui->NextWindowData).Flags = (GImGui->NextWindowData).Flags | 2;
      (pIVar26->NextWindowData).SizeVal.x = 400.0;
      (pIVar26->NextWindowData).SizeVal.y = 400.0;
      (pIVar26->NextWindowData).SizeCond = 4;
      Begin("Debug##Default",(bool *)0x0,0);
      if (0 < (pIVar25->Hooks).Size) {
        lVar49 = 0;
        lVar47 = 0;
        do {
          pIVar12 = (pIVar25->Hooks).Data;
          if (*(int *)(pIVar12 + lVar49 + 4) == 1) {
            (**(code **)(pIVar12 + lVar49 + 0x10))(pIVar25,pIVar12 + lVar49);
          }
          lVar47 = lVar47 + 1;
          lVar49 = lVar49 + 0x20;
        } while (lVar47 < (pIVar25->Hooks).Size);
      }
      return;
    }
  } while( true );
}

Assistant:

void ImGui::NewFrame()
{
    IM_ASSERT(GImGui != NULL && "No current context. Did you call ImGui::CreateContext() and ImGui::SetCurrentContext() ?");
    ImGuiContext& g = *GImGui;

    // Remove pending delete hooks before frame start.
    // This deferred removal avoid issues of removal while iterating the hook vector
    for (int n = g.Hooks.Size - 1; n >= 0; n--)
        if (g.Hooks[n].Type == ImGuiContextHookType_PendingRemoval_)
            g.Hooks.erase(&g.Hooks[n]);

    CallContextHooks(&g, ImGuiContextHookType_NewFramePre);

    // Check and assert for various common IO and Configuration mistakes
    ErrorCheckNewFrameSanityChecks();

    // Load settings on first frame, save settings when modified (after a delay)
    UpdateSettings();

    g.Time += g.IO.DeltaTime;
    g.WithinFrameScope = true;
    g.FrameCount += 1;
    g.TooltipOverrideCount = 0;
    g.WindowsActiveCount = 0;
    g.MenusIdSubmittedThisFrame.resize(0);

    // Calculate frame-rate for the user, as a purely luxurious feature
    g.FramerateSecPerFrameAccum += g.IO.DeltaTime - g.FramerateSecPerFrame[g.FramerateSecPerFrameIdx];
    g.FramerateSecPerFrame[g.FramerateSecPerFrameIdx] = g.IO.DeltaTime;
    g.FramerateSecPerFrameIdx = (g.FramerateSecPerFrameIdx + 1) % IM_ARRAYSIZE(g.FramerateSecPerFrame);
    g.FramerateSecPerFrameCount = ImMin(g.FramerateSecPerFrameCount + 1, IM_ARRAYSIZE(g.FramerateSecPerFrame));
    g.IO.Framerate = (g.FramerateSecPerFrameAccum > 0.0f) ? (1.0f / (g.FramerateSecPerFrameAccum / (float)g.FramerateSecPerFrameCount)) : FLT_MAX;

    UpdateViewportsNewFrame();

    // Setup current font and draw list shared data
    g.IO.Fonts->Locked = true;
    SetCurrentFont(GetDefaultFont());
    IM_ASSERT(g.Font->IsLoaded());
    ImRect virtual_space(FLT_MAX, FLT_MAX, -FLT_MAX, -FLT_MAX);
    for (int n = 0; n < g.Viewports.Size; n++)
        virtual_space.Add(g.Viewports[n]->GetMainRect());
    g.DrawListSharedData.ClipRectFullscreen = virtual_space.ToVec4();
    g.DrawListSharedData.CurveTessellationTol = g.Style.CurveTessellationTol;
    g.DrawListSharedData.SetCircleTessellationMaxError(g.Style.CircleTessellationMaxError);
    g.DrawListSharedData.InitialFlags = ImDrawListFlags_None;
    if (g.Style.AntiAliasedLines)
        g.DrawListSharedData.InitialFlags |= ImDrawListFlags_AntiAliasedLines;
    if (g.Style.AntiAliasedLinesUseTex && !(g.Font->ContainerAtlas->Flags & ImFontAtlasFlags_NoBakedLines))
        g.DrawListSharedData.InitialFlags |= ImDrawListFlags_AntiAliasedLinesUseTex;
    if (g.Style.AntiAliasedFill)
        g.DrawListSharedData.InitialFlags |= ImDrawListFlags_AntiAliasedFill;
    if (g.IO.BackendFlags & ImGuiBackendFlags_RendererHasVtxOffset)
        g.DrawListSharedData.InitialFlags |= ImDrawListFlags_AllowVtxOffset;

    // Mark rendering data as invalid to prevent user who may have a handle on it to use it.
    for (int n = 0; n < g.Viewports.Size; n++)
    {
        ImGuiViewportP* viewport = g.Viewports[n];
        viewport->DrawDataP.Clear();
    }

    // Drag and drop keep the source ID alive so even if the source disappear our state is consistent
    if (g.DragDropActive && g.DragDropPayload.SourceId == g.ActiveId)
        KeepAliveID(g.DragDropPayload.SourceId);

    // Update HoveredId data
    if (!g.HoveredIdPreviousFrame)
        g.HoveredIdTimer = 0.0f;
    if (!g.HoveredIdPreviousFrame || (g.HoveredId && g.ActiveId == g.HoveredId))
        g.HoveredIdNotActiveTimer = 0.0f;
    if (g.HoveredId)
        g.HoveredIdTimer += g.IO.DeltaTime;
    if (g.HoveredId && g.ActiveId != g.HoveredId)
        g.HoveredIdNotActiveTimer += g.IO.DeltaTime;
    g.HoveredIdPreviousFrame = g.HoveredId;
    g.HoveredIdPreviousFrameUsingMouseWheel = g.HoveredIdUsingMouseWheel;
    g.HoveredId = 0;
    g.HoveredIdAllowOverlap = false;
    g.HoveredIdUsingMouseWheel = false;
    g.HoveredIdDisabled = false;

    // Update ActiveId data (clear reference to active widget if the widget isn't alive anymore)
    if (g.ActiveIdIsAlive != g.ActiveId && g.ActiveIdPreviousFrame == g.ActiveId && g.ActiveId != 0)
        ClearActiveID();
    if (g.ActiveId)
        g.ActiveIdTimer += g.IO.DeltaTime;
    g.LastActiveIdTimer += g.IO.DeltaTime;
    g.ActiveIdPreviousFrame = g.ActiveId;
    g.ActiveIdPreviousFrameWindow = g.ActiveIdWindow;
    g.ActiveIdPreviousFrameHasBeenEditedBefore = g.ActiveIdHasBeenEditedBefore;
    g.ActiveIdIsAlive = 0;
    g.ActiveIdHasBeenEditedThisFrame = false;
    g.ActiveIdPreviousFrameIsAlive = false;
    g.ActiveIdIsJustActivated = false;
    if (g.TempInputId != 0 && g.ActiveId != g.TempInputId)
        g.TempInputId = 0;
    if (g.ActiveId == 0)
    {
        g.ActiveIdUsingNavDirMask = 0x00;
        g.ActiveIdUsingNavInputMask = 0x00;
        g.ActiveIdUsingKeyInputMask.ClearAllBits();
    }

    // Drag and drop
    g.DragDropAcceptIdPrev = g.DragDropAcceptIdCurr;
    g.DragDropAcceptIdCurr = 0;
    g.DragDropAcceptIdCurrRectSurface = FLT_MAX;
    g.DragDropWithinSource = false;
    g.DragDropWithinTarget = false;
    g.DragDropHoldJustPressedId = 0;

    // Close popups on focus lost (currently wip/opt-in)
    //if (g.IO.AppFocusLost)
    //    ClosePopupsExceptModals();

    // Process input queue (trickle as many events as possible)
    g.InputEventsTrail.resize(0);
    UpdateInputEvents(g.IO.ConfigInputTrickleEventQueue);

    // Update keyboard input state
    UpdateKeyboardInputs();

    //IM_ASSERT(g.IO.KeyCtrl == IsKeyDown(ImGuiKey_LeftCtrl) || IsKeyDown(ImGuiKey_RightCtrl));
    //IM_ASSERT(g.IO.KeyShift == IsKeyDown(ImGuiKey_LeftShift) || IsKeyDown(ImGuiKey_RightShift));
    //IM_ASSERT(g.IO.KeyAlt == IsKeyDown(ImGuiKey_LeftAlt) || IsKeyDown(ImGuiKey_RightAlt));
    //IM_ASSERT(g.IO.KeySuper == IsKeyDown(ImGuiKey_LeftSuper) || IsKeyDown(ImGuiKey_RightSuper));

    // Update gamepad/keyboard navigation
    NavUpdate();

    // Update mouse input state
    UpdateMouseInputs();

    // Find hovered window
    // (needs to be before UpdateMouseMovingWindowNewFrame so we fill g.HoveredWindowUnderMovingWindow on the mouse release frame)
    UpdateHoveredWindowAndCaptureFlags();

    // Handle user moving window with mouse (at the beginning of the frame to avoid input lag or sheering)
    UpdateMouseMovingWindowNewFrame();

    // Background darkening/whitening
    if (GetTopMostPopupModal() != NULL || (g.NavWindowingTarget != NULL && g.NavWindowingHighlightAlpha > 0.0f))
        g.DimBgRatio = ImMin(g.DimBgRatio + g.IO.DeltaTime * 6.0f, 1.0f);
    else
        g.DimBgRatio = ImMax(g.DimBgRatio - g.IO.DeltaTime * 10.0f, 0.0f);

    g.MouseCursor = ImGuiMouseCursor_Arrow;
    g.WantCaptureMouseNextFrame = g.WantCaptureKeyboardNextFrame = g.WantTextInputNextFrame = -1;

    // Platform IME data: reset for the frame
    g.PlatformImeDataPrev = g.PlatformImeData;
    g.PlatformImeData.WantVisible = false;

    // Mouse wheel scrolling, scale
    UpdateMouseWheel();

    // Mark all windows as not visible and compact unused memory.
    IM_ASSERT(g.WindowsFocusOrder.Size <= g.Windows.Size);
    const float memory_compact_start_time = (g.GcCompactAll || g.IO.ConfigMemoryCompactTimer < 0.0f) ? FLT_MAX : (float)g.Time - g.IO.ConfigMemoryCompactTimer;
    for (int i = 0; i != g.Windows.Size; i++)
    {
        ImGuiWindow* window = g.Windows[i];
        window->WasActive = window->Active;
        window->BeginCount = 0;
        window->Active = false;
        window->WriteAccessed = false;

        // Garbage collect transient buffers of recently unused windows
        if (!window->WasActive && !window->MemoryCompacted && window->LastTimeActive < memory_compact_start_time)
            GcCompactTransientWindowBuffers(window);
    }

    // Garbage collect transient buffers of recently unused tables
    for (int i = 0; i < g.TablesLastTimeActive.Size; i++)
        if (g.TablesLastTimeActive[i] >= 0.0f && g.TablesLastTimeActive[i] < memory_compact_start_time)
            TableGcCompactTransientBuffers(g.Tables.GetByIndex(i));
    for (int i = 0; i < g.TablesTempData.Size; i++)
        if (g.TablesTempData[i].LastTimeActive >= 0.0f && g.TablesTempData[i].LastTimeActive < memory_compact_start_time)
            TableGcCompactTransientBuffers(&g.TablesTempData[i]);
    if (g.GcCompactAll)
        GcCompactTransientMiscBuffers();
    g.GcCompactAll = false;

    // Closing the focused window restore focus to the first active root window in descending z-order
    if (g.NavWindow && !g.NavWindow->WasActive)
        FocusTopMostWindowUnderOne(NULL, NULL);

    // No window should be open at the beginning of the frame.
    // But in order to allow the user to call NewFrame() multiple times without calling Render(), we are doing an explicit clear.
    g.CurrentWindowStack.resize(0);
    g.BeginPopupStack.resize(0);
    g.ItemFlagsStack.resize(0);
    g.ItemFlagsStack.push_back(ImGuiItemFlags_None);
    g.GroupStack.resize(0);

    // [DEBUG] Update debug features
    UpdateDebugToolItemPicker();
    UpdateDebugToolStackQueries();

    // Create implicit/fallback window - which we will only render it if the user has added something to it.
    // We don't use "Debug" to avoid colliding with user trying to create a "Debug" window with custom flags.
    // This fallback is particularly important as it avoid ImGui:: calls from crashing.
    g.WithinFrameScopeWithImplicitWindow = true;
    SetNextWindowSize(ImVec2(400, 400), ImGuiCond_FirstUseEver);
    Begin("Debug##Default");
    IM_ASSERT(g.CurrentWindow->IsFallbackWindow == true);

    CallContextHooks(&g, ImGuiContextHookType_NewFramePost);
}